

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::multiaggregation(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *lp,bool *again)

{
  undefined8 *puVar1;
  uint *puVar2;
  double a;
  bool bVar3;
  bool bVar4;
  undefined1 uVar5;
  fpclass_type fVar6;
  int32_t iVar7;
  int iVar8;
  fpclass_type fVar9;
  int32_t iVar10;
  fpclass_type fVar11;
  int32_t iVar12;
  uint uVar13;
  Item *pIVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  int *piVar18;
  SPxOut *pSVar19;
  char cVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  bool bVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  MultiAggregationPS *this_00;
  Item *pIVar34;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar35;
  cpp_dec_float<50U,_int,_void> *pcVar36;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar37;
  long lVar38;
  long lVar39;
  bool bVar40;
  uint uVar41;
  ulong uVar42;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar43;
  pointer pnVar44;
  long lVar45;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar46;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar47;
  cpp_dec_float<50U,_int,_void> *pcVar48;
  cpp_dec_float<50U,_int,_void> *pcVar49;
  type *ptVar50;
  long lVar51;
  Item *this_01;
  byte bVar52;
  int k;
  long lVar53;
  long in_FS_OFFSET;
  type t;
  int local_95c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxRes;
  ulong local_918;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lhs;
  int local_8bc;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minVal;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  minRes;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhs;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  downLocks;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  upLocks;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxVal;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  updateRow;
  cpp_dec_float<50U,_int,_void> local_708;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  shared_ptr<soplex::Tolerances> local_678;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_668;
  bool *local_660;
  long local_658;
  ulong local_650;
  uint local_648 [2];
  uint auStack_640 [2];
  uint local_638 [2];
  uint auStack_630 [2];
  uint local_628 [4];
  uint local_618 [2];
  uint auStack_610 [2];
  uint local_608 [2];
  uint auStack_600 [2];
  uint local_5f8 [4];
  uint local_5e8 [2];
  uint auStack_5e0 [2];
  uint local_5d8 [2];
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  uint local_5b8 [2];
  uint auStack_5b0 [2];
  uint local_5a8 [2];
  undefined8 uStack_5a0;
  undefined8 local_598;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_588;
  cpp_dec_float<50U,_int,_void> local_548;
  element_type *local_508;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_500;
  uint local_4f8 [2];
  uint auStack_4f0 [2];
  uint local_4e8 [2];
  int local_4e0;
  bool local_4dc;
  fpclass_type local_4d8;
  int32_t local_4d4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4c8;
  cpp_dec_float<50U,_int,_void> local_488;
  element_type *local_448;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_440;
  uint local_438 [2];
  uint auStack_430 [2];
  uint local_428 [2];
  int local_420;
  bool local_41c;
  fpclass_type local_418;
  int32_t local_414;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_408;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_388;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_348;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_308;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_248;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_188;
  cpp_dec_float<50U,_int,_void> local_148;
  cpp_dec_float<50U,_int,_void> local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_658 = (long)(lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thenum;
  iVar33 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  local_660 = again;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&upLocks,iVar33);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&downLocks,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  local_918 = (ulong)(lp->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum;
  if ((long)local_918 < 1) {
    local_95c = 0;
    local_8bc = 0;
    iVar32 = 0;
  }
  else {
    a = *(double *)(in_FS_OFFSET + -8);
    local_668 = &this->m_hist;
    iVar32 = 0;
    local_8bc = 0;
    local_95c = 0;
    do {
      local_650 = local_918;
      local_918 = local_918 - 1;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&upLocks.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_918].m_backend,0);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&downLocks.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[local_918].m_backend,0);
      pIVar14 = (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem;
      iVar27 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[local_918].idx;
      if (1 < pIVar14[iVar27].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        pIVar14 = pIVar14 + iVar27;
        lVar51 = 0;
        lVar53 = 0;
        do {
          pNVar46 = (pIVar14->data).
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .m_elem;
          uVar15 = *(undefined8 *)((long)(pNVar46->val).m_backend.data._M_elems + lVar51 + 0x20);
          lhs.m_backend.data._M_elems._32_5_ = SUB85(uVar15,0);
          lhs.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28);
          puVar2 = (uint *)((long)(pNVar46->val).m_backend.data._M_elems + lVar51);
          lhs.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
          lhs.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
          puVar2 = (uint *)((long)(pNVar46->val).m_backend.data._M_elems + lVar51 + 0x10);
          lhs.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          uVar15 = *(undefined8 *)(puVar2 + 2);
          lhs.m_backend.data._M_elems._24_5_ = SUB85(uVar15,0);
          lhs.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28);
          lhs.m_backend.exp = *(int *)((long)(&(pNVar46->val).m_backend.data + 1) + lVar51);
          lhs.m_backend.neg = *(bool *)((long)(&(pNVar46->val).m_backend.data + 1) + lVar51 + 4);
          lhs.m_backend._48_8_ =
               *(undefined8 *)((long)(&(pNVar46->val).m_backend.data + 1) + lVar51 + 8);
          pcVar49 = &(lp->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).left.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [*(int *)((long)(&((pIVar14->data).
                                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       .m_elem)->val + 1) + lVar51)].m_backend;
          ::soplex::infinity::__tls_init();
          t.m_backend.fpclass = cpp_dec_float_finite;
          t.m_backend.prec_elem = 10;
          t.m_backend.data._M_elems[0] = 0;
          t.m_backend.data._M_elems[1] = 0;
          t.m_backend.data._M_elems[2] = 0;
          t.m_backend.data._M_elems[3] = 0;
          t.m_backend.data._M_elems[4] = 0;
          t.m_backend.data._M_elems[5] = 0;
          t.m_backend.data._M_elems._24_5_ = 0;
          t.m_backend.data._M_elems[7]._1_3_ = 0;
          t.m_backend.data._M_elems._32_5_ = 0;
          t.m_backend.data._M_elems[9]._1_3_ = 0;
          t.m_backend.exp = 0;
          t.m_backend.neg = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&t,-a);
          if (((pcVar49->fpclass == cpp_dec_float_NaN) || (t.m_backend.fpclass == cpp_dec_float_NaN)
              ) || (iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (pcVar49,&t.m_backend), iVar27 < 1)) {
LAB_002ef3ed:
            pcVar49 = &(lp->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).left.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [*(int *)((long)(&((pIVar14->data).
                                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         .m_elem)->val + 1) + lVar51)].m_backend;
            ::soplex::infinity::__tls_init();
            t.m_backend.fpclass = cpp_dec_float_finite;
            t.m_backend.prec_elem = 10;
            t.m_backend.data._M_elems[0] = 0;
            t.m_backend.data._M_elems[1] = 0;
            t.m_backend.data._M_elems[2] = 0;
            t.m_backend.data._M_elems[3] = 0;
            t.m_backend.data._M_elems[4] = 0;
            t.m_backend.data._M_elems[5] = 0;
            t.m_backend.data._M_elems._24_5_ = 0;
            t.m_backend.data._M_elems[7]._1_3_ = 0;
            t.m_backend.data._M_elems._32_5_ = 0;
            t.m_backend.data._M_elems[9]._1_3_ = 0;
            t.m_backend.exp = 0;
            t.m_backend.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&t,-a);
            if (((pcVar49->fpclass == cpp_dec_float_NaN) ||
                (t.m_backend.fpclass == cpp_dec_float_NaN)) ||
               (iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar49,&t.m_backend), iVar27 < 1)) {
              pcVar49 = &(lp->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).right.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start
                         [*(int *)((long)(&((pIVar14->data).
                                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           .m_elem)->val + 1) + lVar51)].m_backend;
              ::soplex::infinity::__tls_init();
              t.m_backend.fpclass = cpp_dec_float_finite;
              t.m_backend.prec_elem = 10;
              t.m_backend.data._M_elems[0] = 0;
              t.m_backend.data._M_elems[1] = 0;
              t.m_backend.data._M_elems[2] = 0;
              t.m_backend.data._M_elems[3] = 0;
              t.m_backend.data._M_elems[4] = 0;
              t.m_backend.data._M_elems[5] = 0;
              t.m_backend.data._M_elems._24_5_ = 0;
              t.m_backend.data._M_elems[7]._1_3_ = 0;
              t.m_backend.data._M_elems._32_5_ = 0;
              t.m_backend.data._M_elems[9]._1_3_ = 0;
              t.m_backend.exp = 0;
              t.m_backend.neg = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)&t,a);
              if ((((pcVar49->fpclass != cpp_dec_float_NaN) &&
                   (t.m_backend.fpclass != cpp_dec_float_NaN)) &&
                  (iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                      (pcVar49,&t.m_backend), iVar27 < 0)) &&
                 (lhs.m_backend.fpclass != cpp_dec_float_NaN)) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&t.m_backend,0,(type *)0x0);
                iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (&lhs.m_backend,&t.m_backend);
                pnVar44 = upLocks.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                if (iVar27 < 1) {
                  if (lhs.m_backend.fpclass != cpp_dec_float_NaN) {
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<long_long>(&t.m_backend,0,(type *)0x0);
                    iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&lhs.m_backend,&t.m_backend);
                    pnVar44 = downLocks.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if (iVar27 < 0) {
                      t.m_backend.fpclass = cpp_dec_float_finite;
                      t.m_backend.prec_elem = 10;
                      t.m_backend.data._M_elems[0] = 0;
                      t.m_backend.data._M_elems[1] = 0;
                      t.m_backend.data._M_elems[2] = 0;
                      t.m_backend.data._M_elems[3] = 0;
                      t.m_backend.data._M_elems[4] = 0;
                      t.m_backend.data._M_elems[5] = 0;
                      t.m_backend.data._M_elems._24_5_ = 0;
                      t.m_backend.data._M_elems[7]._1_3_ = 0;
                      t.m_backend.data._M_elems._32_5_ = 0;
                      t.m_backend.data._M_elems[9]._1_3_ = 0;
                      t.m_backend.exp = 0;
                      t.m_backend.neg = false;
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                      from_unsigned_long_long(&t.m_backend,1);
                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                                (&pnVar44[local_918].m_backend,&t.m_backend);
                    }
                  }
                }
                else {
                  t.m_backend.fpclass = cpp_dec_float_finite;
                  t.m_backend.prec_elem = 10;
                  t.m_backend.data._M_elems[0] = 0;
                  t.m_backend.data._M_elems[1] = 0;
                  t.m_backend.data._M_elems[2] = 0;
                  t.m_backend.data._M_elems[3] = 0;
                  t.m_backend.data._M_elems[4] = 0;
                  t.m_backend.data._M_elems[5] = 0;
                  t.m_backend.data._M_elems._24_5_ = 0;
                  t.m_backend.data._M_elems[7]._1_3_ = 0;
                  t.m_backend.data._M_elems._32_5_ = 0;
                  t.m_backend.data._M_elems[9]._1_3_ = 0;
                  t.m_backend.exp = 0;
                  t.m_backend.neg = false;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  from_unsigned_long_long(&t.m_backend,1);
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            (&pnVar44[local_918].m_backend,&t.m_backend);
                }
              }
            }
            else if (lhs.m_backend.fpclass != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>(&t.m_backend,0,(type *)0x0);
              iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (&lhs.m_backend,&t.m_backend);
              pnVar44 = downLocks.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (iVar27 < 1) {
                if (lhs.m_backend.fpclass != cpp_dec_float_NaN) {
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<long_long>(&t.m_backend,0,(type *)0x0);
                  iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&lhs.m_backend,&t.m_backend);
                  pnVar44 = upLocks.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if (iVar27 < 0) {
                    t.m_backend.fpclass = cpp_dec_float_finite;
                    t.m_backend.prec_elem = 10;
                    t.m_backend.data._M_elems[0] = 0;
                    t.m_backend.data._M_elems[1] = 0;
                    t.m_backend.data._M_elems[2] = 0;
                    t.m_backend.data._M_elems[3] = 0;
                    t.m_backend.data._M_elems[4] = 0;
                    t.m_backend.data._M_elems[5] = 0;
                    t.m_backend.data._M_elems._24_5_ = 0;
                    t.m_backend.data._M_elems[7]._1_3_ = 0;
                    t.m_backend.data._M_elems._32_5_ = 0;
                    t.m_backend.data._M_elems[9]._1_3_ = 0;
                    t.m_backend.exp = 0;
                    t.m_backend.neg = false;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    from_unsigned_long_long(&t.m_backend,1);
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                              (&pnVar44[local_918].m_backend,&t.m_backend);
                  }
                }
              }
              else {
                t.m_backend.fpclass = cpp_dec_float_finite;
                t.m_backend.prec_elem = 10;
                t.m_backend.data._M_elems[0] = 0;
                t.m_backend.data._M_elems[1] = 0;
                t.m_backend.data._M_elems[2] = 0;
                t.m_backend.data._M_elems[3] = 0;
                t.m_backend.data._M_elems[4] = 0;
                t.m_backend.data._M_elems[5] = 0;
                t.m_backend.data._M_elems._24_5_ = 0;
                t.m_backend.data._M_elems[7]._1_3_ = 0;
                t.m_backend.data._M_elems._32_5_ = 0;
                t.m_backend.data._M_elems[9]._1_3_ = 0;
                t.m_backend.exp = 0;
                t.m_backend.neg = false;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                from_unsigned_long_long(&t.m_backend,1);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (&pnVar44[local_918].m_backend,&t.m_backend);
              }
            }
          }
          else {
            pcVar49 = &(lp->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).right.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [*(int *)((long)(&((pIVar14->data).
                                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         .m_elem)->val + 1) + lVar51)].m_backend;
            ::soplex::infinity::__tls_init();
            rhs.m_backend.fpclass = cpp_dec_float_finite;
            rhs.m_backend.prec_elem = 10;
            rhs.m_backend.data._M_elems[0] = 0;
            rhs.m_backend.data._M_elems[1] = 0;
            rhs.m_backend.data._M_elems[2] = 0;
            rhs.m_backend.data._M_elems[3] = 0;
            rhs.m_backend.data._M_elems[4] = 0;
            rhs.m_backend.data._M_elems[5] = 0;
            rhs.m_backend.data._M_elems._24_5_ = 0;
            rhs.m_backend.data._M_elems[7]._1_3_ = 0;
            rhs.m_backend.data._M_elems._32_5_ = 0;
            rhs.m_backend.data._M_elems[9]._1_3_ = 0;
            rhs.m_backend.exp = 0;
            rhs.m_backend.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&rhs,a);
            if (((pcVar49->fpclass == cpp_dec_float_NaN) ||
                (rhs.m_backend.fpclass == cpp_dec_float_NaN)) ||
               (iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar49,&rhs.m_backend),
               pnVar44 = upLocks.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start, -1 < iVar27)) goto LAB_002ef3ed;
            t.m_backend.fpclass = cpp_dec_float_finite;
            t.m_backend.prec_elem = 10;
            t.m_backend.data._M_elems[0] = 0;
            t.m_backend.data._M_elems[1] = 0;
            t.m_backend.data._M_elems[2] = 0;
            t.m_backend.data._M_elems[3] = 0;
            t.m_backend.data._M_elems[4] = 0;
            t.m_backend.data._M_elems[5] = 0;
            t.m_backend.data._M_elems._24_5_ = 0;
            t.m_backend.data._M_elems[7]._1_3_ = 0;
            t.m_backend.data._M_elems._32_5_ = 0;
            t.m_backend.data._M_elems[9]._1_3_ = 0;
            t.m_backend.exp = 0;
            t.m_backend.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::from_unsigned_long_long
                      (&t.m_backend,1);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&pnVar44[local_918].m_backend,&t.m_backend);
            pnVar44 = downLocks.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            t.m_backend.fpclass = cpp_dec_float_finite;
            t.m_backend.prec_elem = 10;
            t.m_backend.data._M_elems[0] = 0;
            t.m_backend.data._M_elems[1] = 0;
            t.m_backend.data._M_elems[2] = 0;
            t.m_backend.data._M_elems[3] = 0;
            t.m_backend.data._M_elems[4] = 0;
            t.m_backend.data._M_elems[5] = 0;
            t.m_backend.data._M_elems._24_5_ = 0;
            t.m_backend.data._M_elems[7]._1_3_ = 0;
            t.m_backend.data._M_elems._32_5_ = 0;
            t.m_backend.data._M_elems[9]._1_3_ = 0;
            t.m_backend.exp = 0;
            t.m_backend.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::from_unsigned_long_long
                      (&t.m_backend,1);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (&pnVar44[local_918].m_backend,&t.m_backend);
          }
          pnVar44 = upLocks.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar53 = lVar53 + 1;
          lVar51 = lVar51 + 0x3c;
        } while (lVar53 < (pIVar14->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused);
        if (upLocks.val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[local_918].m_backend.fpclass ==
            cpp_dec_float_NaN) {
LAB_002ef787:
          pnVar44 = downLocks.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (downLocks.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[local_918].m_backend.fpclass !=
              cpp_dec_float_NaN) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      (&t.m_backend,1,(type *)0x0);
            iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               (&pnVar44[local_918].m_backend,&t.m_backend);
            if (iVar27 == 0) goto LAB_002ef7c9;
          }
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    (&t.m_backend,1,(type *)0x0);
          iVar27 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             (&pnVar44[local_918].m_backend,&t.m_backend);
          if (iVar27 != 0) goto LAB_002ef787;
LAB_002ef7c9:
          pnVar44 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_5f8._0_8_ = *(undefined8 *)(pnVar44[local_918].m_backend.data._M_elems + 8);
          local_618 = pnVar44[local_918].m_backend.data._M_elems[0];
          auStack_610 = *(uint (*) [2])(pnVar44[local_918].m_backend.data._M_elems + 2);
          puVar2 = pnVar44[local_918].m_backend.data._M_elems + 4;
          local_608 = *(uint (*) [2])puVar2;
          auStack_600 = *(uint (*) [2])(puVar2 + 2);
          iVar27 = pnVar44[local_918].m_backend.exp;
          bVar3 = pnVar44[local_918].m_backend.neg;
          fVar6 = pnVar44[local_918].m_backend.fpclass;
          iVar7 = pnVar44[local_918].m_backend.prec_elem;
          pnVar44 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_628._0_8_ = *(undefined8 *)(pnVar44[local_918].m_backend.data._M_elems + 8);
          local_648 = pnVar44[local_918].m_backend.data._M_elems[0];
          auStack_640 = *(uint (*) [2])(pnVar44[local_918].m_backend.data._M_elems + 2);
          puVar2 = pnVar44[local_918].m_backend.data._M_elems + 4;
          local_638 = *(uint (*) [2])puVar2;
          auStack_630 = *(uint (*) [2])(puVar2 + 2);
          if (0 < (pIVar14->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused) {
            iVar8 = pnVar44[local_918].m_backend.exp;
            bVar4 = pnVar44[local_918].m_backend.neg;
            fVar9 = pnVar44[local_918].m_backend.fpclass;
            iVar10 = pnVar44[local_918].m_backend.prec_elem;
            lVar53 = 0;
            lVar51 = 0;
            do {
              pNVar46 = (pIVar14->data).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .m_elem;
              uVar15 = *(undefined8 *)((long)(pNVar46->val).m_backend.data._M_elems + lVar53 + 0x20)
              ;
              puVar1 = (undefined8 *)((long)(pNVar46->val).m_backend.data._M_elems + lVar53);
              ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)*puVar1;
              ptr.
              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
              puVar2 = (uint *)((long)(pNVar46->val).m_backend.data._M_elems + lVar53 + 0x10);
              uVar16 = *(undefined8 *)puVar2;
              uVar17 = *(undefined8 *)(puVar2 + 2);
              iVar31 = *(int *)((long)(&(pNVar46->val).m_backend.data + 1) + lVar53);
              uVar5 = *(undefined1 *)((long)(&(pNVar46->val).m_backend.data + 1) + lVar53 + 4);
              fVar11 = *(fpclass_type *)((long)(&(pNVar46->val).m_backend.data + 1) + lVar53 + 8);
              iVar12 = *(int32_t *)((long)(&(pNVar46->val).m_backend.data + 1) + lVar53 + 0xc);
              iVar30 = *(int *)((long)(&pNVar46->val + 1) + lVar53);
              pnVar44 = (lp->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_3c8.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)(pnVar44[iVar30].m_backend.data._M_elems + 8);
              lhs.m_backend.data._M_elems._32_5_ = local_3c8.m_backend.data._M_elems._32_5_;
              lhs.m_backend.data._M_elems[9]._1_3_ = local_3c8.m_backend.data._M_elems[9]._1_3_;
              lhs.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar44[iVar30].m_backend.data;
              lhs.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)(pnVar44[iVar30].m_backend.data._M_elems + 2);
              puVar2 = pnVar44[iVar30].m_backend.data._M_elems + 4;
              lhs.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_3c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              lhs.m_backend.data._M_elems._24_5_ = local_3c8.m_backend.data._M_elems._24_5_;
              lhs.m_backend.data._M_elems[7]._1_3_ = local_3c8.m_backend.data._M_elems[7]._1_3_;
              lhs.m_backend.exp = pnVar44[iVar30].m_backend.exp;
              lhs.m_backend.neg = pnVar44[iVar30].m_backend.neg;
              local_3c8.m_backend.fpclass = pnVar44[iVar30].m_backend.fpclass;
              local_3c8.m_backend.prec_elem = pnVar44[iVar30].m_backend.prec_elem;
              lhs.m_backend.prec_elem = local_3c8.m_backend.prec_elem;
              lhs.m_backend.fpclass = local_3c8.m_backend.fpclass;
              pnVar44 = (lp->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).right.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_408.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)(pnVar44[iVar30].m_backend.data._M_elems + 8);
              rhs.m_backend.data._M_elems._32_5_ = local_408.m_backend.data._M_elems._32_5_;
              rhs.m_backend.data._M_elems[9]._1_3_ = local_408.m_backend.data._M_elems[9]._1_3_;
              rhs.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar44[iVar30].m_backend.data;
              rhs.m_backend.data._M_elems._8_8_ =
                   *(undefined8 *)(pnVar44[iVar30].m_backend.data._M_elems + 2);
              puVar2 = pnVar44[iVar30].m_backend.data._M_elems + 4;
              rhs.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_408.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              rhs.m_backend.data._M_elems._24_5_ = local_408.m_backend.data._M_elems._24_5_;
              rhs.m_backend.data._M_elems[7]._1_3_ = local_408.m_backend.data._M_elems[7]._1_3_;
              rhs.m_backend.exp = pnVar44[iVar30].m_backend.exp;
              rhs.m_backend.neg = pnVar44[iVar30].m_backend.neg;
              local_408.m_backend.fpclass = pnVar44[iVar30].m_backend.fpclass;
              local_408.m_backend.prec_elem = pnVar44[iVar30].m_backend.prec_elem;
              rhs.m_backend.prec_elem = local_408.m_backend.prec_elem;
              rhs.m_backend.fpclass = local_408.m_backend.fpclass;
              local_408.m_backend.data._M_elems._0_8_ = rhs.m_backend.data._M_elems._0_8_;
              local_408.m_backend.data._M_elems._8_8_ = rhs.m_backend.data._M_elems._8_8_;
              local_408.m_backend.data._M_elems._16_8_ = rhs.m_backend.data._M_elems._16_8_;
              local_408.m_backend.exp = rhs.m_backend.exp;
              local_408.m_backend.neg = rhs.m_backend.neg;
              local_3c8.m_backend.data._M_elems._0_8_ = lhs.m_backend.data._M_elems._0_8_;
              local_3c8.m_backend.data._M_elems._8_8_ = lhs.m_backend.data._M_elems._8_8_;
              local_3c8.m_backend.data._M_elems._16_8_ = lhs.m_backend.data._M_elems._16_8_;
              local_3c8.m_backend.exp = lhs.m_backend.exp;
              local_3c8.m_backend.neg = lhs.m_backend.neg;
              feastol(&local_68,this);
              bVar26 = EQ<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                 (&local_3c8,&local_408,&local_68);
              if (!bVar26) {
                ::soplex::infinity::__tls_init();
                t.m_backend.fpclass = cpp_dec_float_finite;
                t.m_backend.prec_elem = 10;
                t.m_backend.data._M_elems[0] = 0;
                t.m_backend.data._M_elems[1] = 0;
                t.m_backend.data._M_elems[2] = 0;
                t.m_backend.data._M_elems[3] = 0;
                t.m_backend.data._M_elems[4] = 0;
                t.m_backend.data._M_elems[5] = 0;
                t.m_backend.data._M_elems._24_5_ = 0;
                t.m_backend.data._M_elems[7]._1_3_ = 0;
                t.m_backend.data._M_elems._32_5_ = 0;
                t.m_backend.data._M_elems[9]._1_3_ = 0;
                t.m_backend.exp = 0;
                t.m_backend.neg = false;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&t,-a);
                bVar26 = false;
                if ((lhs.m_backend.fpclass != cpp_dec_float_NaN) &&
                   (t.m_backend.fpclass != cpp_dec_float_NaN)) {
                  iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&lhs.m_backend,&t.m_backend);
                  bVar26 = 0 < iVar28;
                }
                ::soplex::infinity::__tls_init();
                t.m_backend.fpclass = cpp_dec_float_finite;
                t.m_backend.prec_elem = 10;
                t.m_backend.data._M_elems[0] = 0;
                t.m_backend.data._M_elems[1] = 0;
                t.m_backend.data._M_elems[2] = 0;
                t.m_backend.data._M_elems[3] = 0;
                t.m_backend.data._M_elems[4] = 0;
                t.m_backend.data._M_elems[5] = 0;
                t.m_backend.data._M_elems._24_5_ = 0;
                t.m_backend.data._M_elems[7]._1_3_ = 0;
                t.m_backend.data._M_elems._32_5_ = 0;
                t.m_backend.data._M_elems[9]._1_3_ = 0;
                t.m_backend.exp = 0;
                t.m_backend.neg = false;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&t,a);
                bVar52 = 0;
                if ((rhs.m_backend.fpclass != cpp_dec_float_NaN) &&
                   (t.m_backend.fpclass != cpp_dec_float_NaN)) {
                  iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&rhs.m_backend,&t.m_backend);
                  bVar52 = (byte)((uint)iVar28 >> 0x1f);
                }
                iVar28 = (lp->
                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ).
                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .set.theitem
                         [(lp->
                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).
                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .set.thekey[iVar30].idx].data.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused;
                uVar41 = (iVar28 == 4) + 1;
                if (iVar28 == 3) {
                  uVar41 = 3;
                }
                uVar42 = (ulong)uVar41;
                if (iVar28 < 3) {
                  uVar42 = 0x7fffffff;
                }
                if (bVar26) {
                  pNVar46 = (pIVar14->data).
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .m_elem;
                  if (*(int *)((long)(&(pNVar46->val).m_backend.data + 1) + lVar53 + 8) == 2) {
LAB_002efd2d:
                    pNVar46 = (pIVar14->data).
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .m_elem;
                    if (*(int *)((long)(&(pNVar46->val).m_backend.data + 1) + lVar53 + 8) != 2) {
                      t.m_backend.fpclass = cpp_dec_float_finite;
                      t.m_backend.prec_elem = 10;
                      t.m_backend.data._M_elems[0] = 0;
                      t.m_backend.data._M_elems[1] = 0;
                      t.m_backend.data._M_elems[2] = 0;
                      t.m_backend.data._M_elems[3] = 0;
                      t.m_backend.data._M_elems[4] = 0;
                      t.m_backend.data._M_elems[5] = 0;
                      t.m_backend.data._M_elems._24_5_ = 0;
                      t.m_backend.data._M_elems[7]._1_3_ = 0;
                      t.m_backend.data._M_elems._32_5_ = 0;
                      t.m_backend.data._M_elems[9]._1_3_ = 0;
                      t.m_backend.exp = 0;
                      t.m_backend.neg = false;
                      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                ((cpp_dec_float<50u,int,void> *)&t.m_backend,0.0);
                      iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare((cpp_dec_float<50U,_int,_void> *)
                                       ((long)(pNVar46->val).m_backend.data._M_elems + lVar53),
                                       &t.m_backend);
                      if ((iVar28 < 0) &&
                         (pnVar44 = (lp->
                                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).object.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                         pnVar44[local_918].m_backend.fpclass != cpp_dec_float_NaN)) {
                        t.m_backend.fpclass = cpp_dec_float_finite;
                        t.m_backend.prec_elem = 10;
                        t.m_backend.data._M_elems[0] = 0;
                        t.m_backend.data._M_elems[1] = 0;
                        t.m_backend.data._M_elems[2] = 0;
                        t.m_backend.data._M_elems[3] = 0;
                        t.m_backend.data._M_elems[4] = 0;
                        t.m_backend.data._M_elems[5] = 0;
                        t.m_backend.data._M_elems._24_5_ = 0;
                        t.m_backend.data._M_elems[7]._1_3_ = 0;
                        t.m_backend.data._M_elems._32_5_ = 0;
                        t.m_backend.data._M_elems[9]._1_3_ = 0;
                        t.m_backend.exp = 0;
                        t.m_backend.neg = false;
                        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                  ((cpp_dec_float<50u,int,void> *)&t.m_backend,0.0);
                        iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                 compare(&pnVar44[local_918].m_backend,&t.m_backend);
                        pnVar44 = upLocks.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start;
                        if ((-1 < iVar28) &&
                           (upLocks.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[local_918].m_backend.fpclass
                            != cpp_dec_float_NaN)) {
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                          cpp_dec_float<long_long>(&t.m_backend,1,(type *)0x0);
                          iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                   compare(&pnVar44[local_918].m_backend,&t.m_backend);
                          pnVar44 = downLocks.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          if ((iVar28 == 0) &&
                             (downLocks.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[local_918].m_backend.fpclass
                              != cpp_dec_float_NaN)) {
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            cpp_dec_float<long_long>(&t.m_backend,uVar42,(type *)0x0);
                            iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>
                                     ::compare(&pnVar44[local_918].m_backend,&t.m_backend);
                            bVar26 = iVar28 < 1;
                            goto LAB_002efe3a;
                          }
                        }
                      }
                    }
                    goto LAB_002efe37;
                  }
                  t.m_backend.fpclass = cpp_dec_float_finite;
                  t.m_backend.prec_elem = 10;
                  t.m_backend.data._M_elems[0] = 0;
                  t.m_backend.data._M_elems[1] = 0;
                  t.m_backend.data._M_elems[2] = 0;
                  t.m_backend.data._M_elems[3] = 0;
                  t.m_backend.data._M_elems[4] = 0;
                  t.m_backend.data._M_elems[5] = 0;
                  t.m_backend.data._M_elems._24_5_ = 0;
                  t.m_backend.data._M_elems[7]._1_3_ = 0;
                  t.m_backend.data._M_elems._32_5_ = 0;
                  t.m_backend.data._M_elems[9]._1_3_ = 0;
                  t.m_backend.exp = 0;
                  t.m_backend.neg = false;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)&t.m_backend,0.0);
                  iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)(pNVar46->val).m_backend.data._M_elems + lVar53),
                                      &t.m_backend);
                  if ((iVar28 < 1) ||
                     (pnVar44 = (lp->
                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).object.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                     pnVar44[local_918].m_backend.fpclass == cpp_dec_float_NaN)) goto LAB_002efd2d;
                  t.m_backend.fpclass = cpp_dec_float_finite;
                  t.m_backend.prec_elem = 10;
                  t.m_backend.data._M_elems[0] = 0;
                  t.m_backend.data._M_elems[1] = 0;
                  t.m_backend.data._M_elems[2] = 0;
                  t.m_backend.data._M_elems[3] = 0;
                  t.m_backend.data._M_elems[4] = 0;
                  t.m_backend.data._M_elems[5] = 0;
                  t.m_backend.data._M_elems._24_5_ = 0;
                  t.m_backend.data._M_elems[7]._1_3_ = 0;
                  t.m_backend.data._M_elems._32_5_ = 0;
                  t.m_backend.data._M_elems[9]._1_3_ = 0;
                  t.m_backend.exp = 0;
                  t.m_backend.neg = false;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)&t.m_backend,0.0);
                  iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&pnVar44[local_918].m_backend,&t.m_backend);
                  pnVar44 = downLocks.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if ((0 < iVar28) ||
                     (downLocks.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_918].m_backend.fpclass ==
                      cpp_dec_float_NaN)) goto LAB_002efd2d;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<long_long>(&t.m_backend,1,(type *)0x0);
                  iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&pnVar44[local_918].m_backend,&t.m_backend);
                  pnVar44 = upLocks.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if ((iVar28 != 0) ||
                     (upLocks.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_918].m_backend.fpclass ==
                      cpp_dec_float_NaN)) goto LAB_002efd2d;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<long_long>(&t.m_backend,uVar42,(type *)0x0);
                  iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&pnVar44[local_918].m_backend,&t.m_backend);
                  if (0 < iVar28) goto LAB_002efd2d;
                  bVar26 = true;
                }
                else {
LAB_002efe37:
                  bVar26 = false;
                }
LAB_002efe3a:
                if (bVar52 == 0) goto LAB_002f007b;
                pNVar46 = (pIVar14->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .m_elem;
                if (*(int *)((long)(&(pNVar46->val).m_backend.data + 1) + lVar53 + 8) == 2) {
LAB_002eff71:
                  pNVar46 = (pIVar14->data).
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .m_elem;
                  if (*(int *)((long)(&(pNVar46->val).m_backend.data + 1) + lVar53 + 8) == 2) {
LAB_002f007b:
                    bVar40 = false;
                  }
                  else {
                    t.m_backend.fpclass = cpp_dec_float_finite;
                    t.m_backend.prec_elem = 10;
                    t.m_backend.data._M_elems[0] = 0;
                    t.m_backend.data._M_elems[1] = 0;
                    t.m_backend.data._M_elems[2] = 0;
                    t.m_backend.data._M_elems[3] = 0;
                    t.m_backend.data._M_elems[4] = 0;
                    t.m_backend.data._M_elems[5] = 0;
                    t.m_backend.data._M_elems._24_5_ = 0;
                    t.m_backend.data._M_elems[7]._1_3_ = 0;
                    t.m_backend.data._M_elems._32_5_ = 0;
                    t.m_backend.data._M_elems[9]._1_3_ = 0;
                    t.m_backend.exp = 0;
                    t.m_backend.neg = false;
                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                              ((cpp_dec_float<50u,int,void> *)&t.m_backend,0.0);
                    iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)
                                        ((long)(pNVar46->val).m_backend.data._M_elems + lVar53),
                                        &t.m_backend);
                    if ((-1 < iVar28) ||
                       (pnVar44 = (lp->
                                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).object.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                       pnVar44[local_918].m_backend.fpclass == cpp_dec_float_NaN))
                    goto LAB_002f007b;
                    t.m_backend.fpclass = cpp_dec_float_finite;
                    t.m_backend.prec_elem = 10;
                    t.m_backend.data._M_elems[0] = 0;
                    t.m_backend.data._M_elems[1] = 0;
                    t.m_backend.data._M_elems[2] = 0;
                    t.m_backend.data._M_elems[3] = 0;
                    t.m_backend.data._M_elems[4] = 0;
                    t.m_backend.data._M_elems[5] = 0;
                    t.m_backend.data._M_elems._24_5_ = 0;
                    t.m_backend.data._M_elems[7]._1_3_ = 0;
                    t.m_backend.data._M_elems._32_5_ = 0;
                    t.m_backend.data._M_elems[9]._1_3_ = 0;
                    t.m_backend.exp = 0;
                    t.m_backend.neg = false;
                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                              ((cpp_dec_float<50u,int,void> *)&t.m_backend,0.0);
                    iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&pnVar44[local_918].m_backend,&t.m_backend);
                    pnVar44 = downLocks.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if ((0 < iVar28) ||
                       (downLocks.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[local_918].m_backend.fpclass ==
                        cpp_dec_float_NaN)) goto LAB_002f007b;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<long_long>(&t.m_backend,1,(type *)0x0);
                    iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&pnVar44[local_918].m_backend,&t.m_backend);
                    pnVar44 = upLocks.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    if ((iVar28 != 0) ||
                       (upLocks.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[local_918].m_backend.fpclass ==
                        cpp_dec_float_NaN)) goto LAB_002f007b;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                    cpp_dec_float<long_long>(&t.m_backend,uVar42,(type *)0x0);
                    iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       (&pnVar44[local_918].m_backend,&t.m_backend);
                    bVar40 = iVar28 < 1;
                  }
                  if (!(bool)(bVar26 | bVar40)) goto LAB_002f0ba3;
                }
                else {
                  t.m_backend.fpclass = cpp_dec_float_finite;
                  t.m_backend.prec_elem = 10;
                  t.m_backend.data._M_elems[0] = 0;
                  t.m_backend.data._M_elems[1] = 0;
                  t.m_backend.data._M_elems[2] = 0;
                  t.m_backend.data._M_elems[3] = 0;
                  t.m_backend.data._M_elems[4] = 0;
                  t.m_backend.data._M_elems[5] = 0;
                  t.m_backend.data._M_elems._24_5_ = 0;
                  t.m_backend.data._M_elems[7]._1_3_ = 0;
                  t.m_backend.data._M_elems._32_5_ = 0;
                  t.m_backend.data._M_elems[9]._1_3_ = 0;
                  t.m_backend.exp = 0;
                  t.m_backend.neg = false;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)&t.m_backend,0.0);
                  iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)(pNVar46->val).m_backend.data._M_elems + lVar53),
                                      &t.m_backend);
                  if ((iVar28 < 1) ||
                     (pnVar44 = (lp->
                                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).object.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                     pnVar44[local_918].m_backend.fpclass == cpp_dec_float_NaN)) goto LAB_002eff71;
                  t.m_backend.fpclass = cpp_dec_float_finite;
                  t.m_backend.prec_elem = 10;
                  t.m_backend.data._M_elems[0] = 0;
                  t.m_backend.data._M_elems[1] = 0;
                  t.m_backend.data._M_elems[2] = 0;
                  t.m_backend.data._M_elems[3] = 0;
                  t.m_backend.data._M_elems[4] = 0;
                  t.m_backend.data._M_elems[5] = 0;
                  t.m_backend.data._M_elems._24_5_ = 0;
                  t.m_backend.data._M_elems[7]._1_3_ = 0;
                  t.m_backend.data._M_elems._32_5_ = 0;
                  t.m_backend.data._M_elems[9]._1_3_ = 0;
                  t.m_backend.exp = 0;
                  t.m_backend.neg = false;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)&t.m_backend,0.0);
                  iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&pnVar44[local_918].m_backend,&t.m_backend);
                  pnVar44 = upLocks.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if ((iVar28 < 0) ||
                     (upLocks.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_918].m_backend.fpclass ==
                      cpp_dec_float_NaN)) goto LAB_002eff71;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<long_long>(&t.m_backend,1,(type *)0x0);
                  iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&pnVar44[local_918].m_backend,&t.m_backend);
                  pnVar44 = downLocks.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if ((iVar28 != 0) ||
                     (downLocks.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[local_918].m_backend.fpclass ==
                      cpp_dec_float_NaN)) goto LAB_002eff71;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                  cpp_dec_float<long_long>(&t.m_backend,uVar42,(type *)0x0);
                  iVar28 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (&pnVar44[local_918].m_backend,&t.m_backend);
                  if (0 < iVar28) goto LAB_002eff71;
                  bVar40 = true;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&minRes.m_backend,0,(type *)0x0);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>(&maxRes.m_backend,0,(type *)0x0);
                iVar28 = (int)local_918;
                computeMinMaxResidualActivity
                          (this,lp,iVar30,iVar28,&minRes,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&maxRes.m_backend);
                if (bVar26) {
                  minVal.m_backend.fpclass = cpp_dec_float_finite;
                  minVal.m_backend.prec_elem = 10;
                  minVal.m_backend.data._M_elems[0] = 0;
                  minVal.m_backend.data._M_elems[1] = 0;
                  minVal.m_backend.data._M_elems[2] = 0;
                  minVal.m_backend.data._M_elems[3] = 0;
                  minVal.m_backend.data._M_elems[4] = 0;
                  minVal.m_backend.data._M_elems[5] = 0;
                  minVal.m_backend.data._M_elems._24_5_ = 0;
                  minVal.m_backend.data._M_elems[7]._1_3_ = 0;
                  minVal.m_backend.data._M_elems._32_5_ = 0;
                  minVal.m_backend.data._M_elems[9]._1_3_ = 0;
                  minVal.m_backend.exp = 0;
                  minVal.m_backend.neg = false;
                  maxVal.m_backend.fpclass = cpp_dec_float_finite;
                  maxVal.m_backend.prec_elem = 10;
                  maxVal.m_backend.data._M_elems[0] = 0;
                  maxVal.m_backend.data._M_elems[1] = 0;
                  maxVal.m_backend.data._M_elems[2] = 0;
                  maxVal.m_backend.data._M_elems[3] = 0;
                  maxVal.m_backend.data._M_elems[4] = 0;
                  maxVal.m_backend.data._M_elems[5] = 0;
                  maxVal.m_backend.data._M_elems._24_5_ = 0;
                  maxVal.m_backend.data._M_elems[7]._1_3_ = 0;
                  maxVal.m_backend.data._M_elems._32_5_ = 0;
                  maxVal.m_backend.data._M_elems[9]._1_3_ = 0;
                  maxVal.m_backend.exp = 0;
                  maxVal.m_backend.neg = false;
                  local_188.m_backend.data._M_elems[7]._1_3_ = lhs.m_backend.data._M_elems[7]._1_3_;
                  local_188.m_backend.data._M_elems._24_5_ = lhs.m_backend.data._M_elems._24_5_;
                  local_188.m_backend.data._M_elems[0] = lhs.m_backend.data._M_elems[0];
                  local_188.m_backend.data._M_elems[1] = lhs.m_backend.data._M_elems[1];
                  local_188.m_backend.data._M_elems[2] = lhs.m_backend.data._M_elems[2];
                  local_188.m_backend.data._M_elems[3] = lhs.m_backend.data._M_elems[3];
                  local_188.m_backend.data._M_elems[4] = lhs.m_backend.data._M_elems[4];
                  local_188.m_backend.data._M_elems[5] = lhs.m_backend.data._M_elems[5];
                  local_188.m_backend.data._M_elems[9]._1_3_ = lhs.m_backend.data._M_elems[9]._1_3_;
                  local_188.m_backend.data._M_elems._32_5_ = lhs.m_backend.data._M_elems._32_5_;
                  local_188.m_backend.exp = lhs.m_backend.exp;
                  local_188.m_backend.neg = lhs.m_backend.neg;
                  local_188.m_backend.fpclass = lhs.m_backend.fpclass;
                  local_188.m_backend.prec_elem = lhs.m_backend.prec_elem;
                  local_448 = ptr.
                              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr;
                  p_Stack_440 = ptr.
                                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi;
                  local_1c8.m_backend.data._M_elems[9]._1_3_ =
                       minRes.m_backend.data._M_elems[9]._1_3_;
                  local_1c8.m_backend.data._M_elems._32_5_ = minRes.m_backend.data._M_elems._32_5_;
                  local_1c8.m_backend.data._M_elems[7]._1_3_ =
                       minRes.m_backend.data._M_elems[7]._1_3_;
                  local_1c8.m_backend.data._M_elems._24_5_ = minRes.m_backend.data._M_elems._24_5_;
                  local_1c8.m_backend.data._M_elems[4] = minRes.m_backend.data._M_elems[4];
                  local_1c8.m_backend.data._M_elems[5] = minRes.m_backend.data._M_elems[5];
                  local_1c8.m_backend.data._M_elems[0] = minRes.m_backend.data._M_elems[0];
                  local_1c8.m_backend.data._M_elems[1] = minRes.m_backend.data._M_elems[1];
                  local_1c8.m_backend.data._M_elems[2] = minRes.m_backend.data._M_elems[2];
                  local_1c8.m_backend.data._M_elems[3] = minRes.m_backend.data._M_elems[3];
                  local_1c8.m_backend.exp = minRes.m_backend.exp;
                  local_1c8.m_backend.neg = minRes.m_backend.neg;
                  local_1c8.m_backend.fpclass = minRes.m_backend.fpclass;
                  local_1c8.m_backend.prec_elem = minRes.m_backend.prec_elem;
                  local_208.m_backend.data._M_elems[9]._1_3_ =
                       maxRes.m_backend.data._M_elems[9]._1_3_;
                  local_208.m_backend.data._M_elems._32_5_ = maxRes.m_backend.data._M_elems._32_5_;
                  local_208.m_backend.data._M_elems[7]._1_3_ =
                       maxRes.m_backend.data._M_elems[7]._1_3_;
                  local_208.m_backend.data._M_elems._24_5_ = maxRes.m_backend.data._M_elems._24_5_;
                  local_208.m_backend.data._M_elems[4] = maxRes.m_backend.data._M_elems[4];
                  local_208.m_backend.data._M_elems[5] = maxRes.m_backend.data._M_elems[5];
                  local_208.m_backend.data._M_elems[0] = maxRes.m_backend.data._M_elems[0];
                  local_208.m_backend.data._M_elems[1] = maxRes.m_backend.data._M_elems[1];
                  local_208.m_backend.data._M_elems[2] = maxRes.m_backend.data._M_elems[2];
                  local_208.m_backend.data._M_elems[3] = maxRes.m_backend.data._M_elems[3];
                  local_208.m_backend.exp = maxRes.m_backend.exp;
                  local_208.m_backend.neg = maxRes.m_backend.neg;
                  local_208.m_backend.fpclass = maxRes.m_backend.fpclass;
                  local_208.m_backend.prec_elem = maxRes.m_backend.prec_elem;
                  local_438 = (uint  [2])uVar16;
                  auStack_430 = (uint  [2])uVar17;
                  local_428 = (uint  [2])uVar15;
                  local_420 = iVar31;
                  local_41c = (bool)uVar5;
                  local_418 = fVar11;
                  local_414 = iVar12;
                  computeMinMaxValues(this,lp,&local_188,
                                      (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)&local_448,&local_1c8,&local_208,&minVal,&maxVal);
                  ::soplex::infinity::__tls_init();
                  local_708.fpclass = cpp_dec_float_finite;
                  local_708.prec_elem = 10;
                  local_708.data._M_elems[0] = 0;
                  local_708.data._M_elems[1] = 0;
                  local_708.data._M_elems[2] = 0;
                  local_708.data._M_elems[3] = 0;
                  local_708.data._M_elems[4] = 0;
                  local_708.data._M_elems[5] = 0;
                  local_708.data._M_elems._24_5_ = 0;
                  local_708.data._M_elems[7]._1_3_ = 0;
                  local_708.data._M_elems._32_5_ = 0;
                  local_708.data._M_elems[9]._1_3_ = 0;
                  local_708.exp = 0;
                  local_708.neg = false;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)&local_708,-a);
                  if (((minVal.m_backend.fpclass == cpp_dec_float_NaN) ||
                      (local_708.fpclass == cpp_dec_float_NaN)) ||
                     (iVar29 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&minVal.m_backend,&local_708),
                     uVar24 = minVal.m_backend._48_8_, bVar26 = minVal.m_backend.neg,
                     iVar30 = minVal.m_backend.exp, iVar29 < 1)) goto LAB_002f063e;
                  local_598 = CONCAT35(minVal.m_backend.data._M_elems[9]._1_3_,
                                       minVal.m_backend.data._M_elems._32_5_);
                  uStack_5a0 = CONCAT35(minVal.m_backend.data._M_elems[7]._1_3_,
                                        minVal.m_backend.data._M_elems._24_5_);
                  local_5a8[0] = minVal.m_backend.data._M_elems[4];
                  local_5a8[1] = minVal.m_backend.data._M_elems[5];
                  local_5b8[0] = minVal.m_backend.data._M_elems[0];
                  local_5b8[1] = minVal.m_backend.data._M_elems[1];
                  auStack_5b0[0] = minVal.m_backend.data._M_elems[2];
                  auStack_5b0[1] = minVal.m_backend.data._M_elems[3];
                  local_488.data._M_elems[0] = local_618[0];
                  local_488.data._M_elems[1] = local_618[1];
                  local_488.data._M_elems[2] = auStack_610[0];
                  local_488.data._M_elems[3] = auStack_610[1];
                  local_488.data._M_elems[4] = local_608[0];
                  local_488.data._M_elems[5] = local_608[1];
                  local_488.data._M_elems[6] = auStack_600[0];
                  local_488.data._M_elems[7] = auStack_600[1];
                  local_488.data._M_elems[8] = local_5f8[0];
                  local_488.data._M_elems[9] = local_5f8[1];
                  local_488.exp = iVar27;
                  local_488.neg = bVar3;
                  local_488.fpclass = fVar6;
                  local_488.prec_elem = iVar7;
                  feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_110,this);
                  uVar25 = minVal.m_backend._48_8_;
                  t.m_backend.data._M_elems._32_5_ = SUB85(local_598,0);
                  t.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_598 >> 0x28);
                  t.m_backend.data._M_elems[4] = local_5a8[0];
                  t.m_backend.data._M_elems[5] = local_5a8[1];
                  t.m_backend.data._M_elems._24_5_ = SUB85(uStack_5a0,0);
                  t.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_5a0 >> 0x28);
                  t.m_backend.data._M_elems[0] = local_5b8[0];
                  t.m_backend.data._M_elems[1] = local_5b8[1];
                  t.m_backend.data._M_elems[2] = auStack_5b0[0];
                  t.m_backend.data._M_elems[3] = auStack_5b0[1];
                  t.m_backend.exp = iVar30;
                  t.m_backend.neg = bVar26;
                  minVal.m_backend.fpclass = (fpclass_type)uVar24;
                  minVal.m_backend.prec_elem = SUB84(uVar24,4);
                  t.m_backend.fpclass = minVal.m_backend.fpclass;
                  t.m_backend.prec_elem = minVal.m_backend.prec_elem;
                  minVal.m_backend._48_8_ = uVar25;
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                            (&t.m_backend,&local_488);
                  if (((t.m_backend.fpclass == cpp_dec_float_NaN) ||
                      (local_110.fpclass == cpp_dec_float_NaN)) ||
                     (iVar30 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&t.m_backend,&local_110), iVar30 < 1)) goto LAB_002f063e;
                  ::soplex::infinity::__tls_init();
                  updateRow.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  updateRow.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                  updateRow.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)&updateRow,a);
                  if ((maxVal.m_backend.fpclass == cpp_dec_float_NaN) ||
                     (iVar30 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&maxVal.m_backend,(cpp_dec_float<50U,_int,_void> *)&updateRow
                                      ), -1 < iVar30)) goto LAB_002f063e;
                  local_248.m_backend.data._M_elems[9]._1_3_ =
                       maxVal.m_backend.data._M_elems[9]._1_3_;
                  local_248.m_backend.data._M_elems._32_5_ = maxVal.m_backend.data._M_elems._32_5_;
                  local_248.m_backend.data._M_elems[7]._1_3_ =
                       maxVal.m_backend.data._M_elems[7]._1_3_;
                  local_248.m_backend.data._M_elems._24_5_ = maxVal.m_backend.data._M_elems._24_5_;
                  local_248.m_backend.data._M_elems[4] = maxVal.m_backend.data._M_elems[4];
                  local_248.m_backend.data._M_elems[5] = maxVal.m_backend.data._M_elems[5];
                  local_248.m_backend.data._M_elems[0] = maxVal.m_backend.data._M_elems[0];
                  local_248.m_backend.data._M_elems[1] = maxVal.m_backend.data._M_elems[1];
                  local_248.m_backend.data._M_elems[2] = maxVal.m_backend.data._M_elems[2];
                  local_248.m_backend.data._M_elems[3] = maxVal.m_backend.data._M_elems[3];
                  local_248.m_backend.exp = maxVal.m_backend.exp;
                  local_248.m_backend.neg = maxVal.m_backend.neg;
                  local_248.m_backend.fpclass = maxVal.m_backend.fpclass;
                  local_248.m_backend.prec_elem = maxVal.m_backend.prec_elem;
                  local_4c8.m_backend.data._M_elems[0] = local_648[0];
                  local_4c8.m_backend.data._M_elems[1] = local_648[1];
                  local_4c8.m_backend.data._M_elems[2] = auStack_640[0];
                  local_4c8.m_backend.data._M_elems[3] = auStack_640[1];
                  local_4c8.m_backend.data._M_elems[4] = local_638[0];
                  local_4c8.m_backend.data._M_elems[5] = local_638[1];
                  local_4c8.m_backend.data._M_elems[6] = auStack_630[0];
                  local_4c8.m_backend.data._M_elems[7] = auStack_630[1];
                  local_4c8.m_backend.data._M_elems[8] = local_628[0];
                  local_4c8.m_backend.data._M_elems[9] = local_628[1];
                  local_4c8.m_backend.exp = iVar8;
                  local_4c8.m_backend.neg = bVar4;
                  local_4c8.m_backend.fpclass = fVar9;
                  local_4c8.m_backend.prec_elem = iVar10;
                  feastol(&local_a0,this);
                  bVar26 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                     (&local_248,&local_4c8,&local_a0);
                  if (!bVar26) goto LAB_002f063e;
                  uVar41 = *(uint *)((long)(&((pIVar14->data).
                                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                             .m_elem)->val + 1) + lVar53);
                  bVar3 = true;
LAB_002f0c5a:
                  if (-1 < (int)uVar41) {
                    this_01 = (lp->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.theitem +
                              (lp->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thekey[uVar41].idx;
                    pVVar37 = &(lp->
                               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).right;
                    if (bVar3) {
                      pVVar37 = &(lp->
                                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).left;
                    }
                    pnVar44 = (pVVar37->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    uVar15 = *(undefined8 *)(pnVar44[uVar41].m_backend.data._M_elems + 8);
                    lhs.m_backend.data._M_elems._32_5_ = SUB85(uVar15,0);
                    lhs.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28);
                    lhs.m_backend.data._M_elems._0_8_ =
                         *(undefined8 *)&pnVar44[uVar41].m_backend.data;
                    lhs.m_backend.data._M_elems._8_8_ =
                         *(undefined8 *)(pnVar44[uVar41].m_backend.data._M_elems + 2);
                    puVar2 = pnVar44[uVar41].m_backend.data._M_elems + 4;
                    lhs.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
                    uVar15 = *(undefined8 *)(puVar2 + 2);
                    lhs.m_backend.data._M_elems._24_5_ = SUB85(uVar15,0);
                    lhs.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28);
                    lhs.m_backend.exp = pnVar44[uVar41].m_backend.exp;
                    lhs.m_backend.neg = pnVar44[uVar41].m_backend.neg;
                    lhs.m_backend.fpclass = pnVar44[uVar41].m_backend.fpclass;
                    lhs.m_backend.prec_elem = pnVar44[uVar41].m_backend.prec_elem;
                    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::operator[](&rhs,(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)this_01,iVar28);
                    this_00 = (MultiAggregationPS *)operator_new(0x160);
                    local_388.m_backend.data._M_elems[9]._1_3_ =
                         lhs.m_backend.data._M_elems[9]._1_3_;
                    local_388.m_backend.data._M_elems._32_5_ = lhs.m_backend.data._M_elems._32_5_;
                    local_388.m_backend.data._M_elems[7]._1_3_ =
                         lhs.m_backend.data._M_elems[7]._1_3_;
                    local_388.m_backend.data._M_elems._24_5_ = lhs.m_backend.data._M_elems._24_5_;
                    local_388.m_backend.data._M_elems[4] = lhs.m_backend.data._M_elems[4];
                    local_388.m_backend.data._M_elems[5] = lhs.m_backend.data._M_elems[5];
                    local_388.m_backend.data._M_elems[0] = lhs.m_backend.data._M_elems[0];
                    local_388.m_backend.data._M_elems[1] = lhs.m_backend.data._M_elems[1];
                    local_388.m_backend.data._M_elems[2] = lhs.m_backend.data._M_elems[2];
                    local_388.m_backend.data._M_elems[3] = lhs.m_backend.data._M_elems[3];
                    local_388.m_backend.exp = lhs.m_backend.exp;
                    local_388.m_backend.neg = lhs.m_backend.neg;
                    local_388.m_backend.fpclass = lhs.m_backend.fpclass;
                    local_388.m_backend.prec_elem = lhs.m_backend.prec_elem;
                    local_678.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr = (this->
                             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             )._tolerances.
                             super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    local_678.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi =
                         (this->
                         super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         )._tolerances.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
                    if (local_678.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        (local_678.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_678.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        (local_678.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi)->_M_use_count =
                             (local_678.
                              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi)->_M_use_count + 1;
                      }
                    }
                    MultiAggregationPS::MultiAggregationPS
                              (this_00,lp,this,uVar41,iVar28,&local_388,&local_678);
                    ptr.
                    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)this_00;
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                    __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::MultiAggregationPS*>
                              (&ptr.
                                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount,this_00);
                    if (local_678.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (local_678.
                                 super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi);
                    }
                    std::
                    vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                    ::push_back(&local_668->data,&ptr);
                    iVar27 = (pIVar14->data).
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .memused;
                    if (0 < iVar27) {
                      lVar51 = 0;
                      do {
                        uVar13 = (pIVar14->data).
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem[lVar51].idx;
                        lVar53 = (long)(int)uVar13;
                        if (uVar13 != uVar41) {
                          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::VectorBase(&updateRow,
                                       (lp->
                                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).
                                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       .set.thenum);
                          iVar27 = (pIVar14->data).
                                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .m_elem[lVar51].idx;
                          pnVar44 = (lp->
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).right.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          uVar15 = *(undefined8 *)(pnVar44[iVar27].m_backend.data._M_elems + 8);
                          maxVal.m_backend.data._M_elems._32_5_ = SUB85(uVar15,0);
                          maxVal.m_backend.data._M_elems[9]._1_3_ =
                               (undefined3)((ulong)uVar15 >> 0x28);
                          maxVal.m_backend.data._M_elems._0_8_ =
                               *(undefined8 *)&pnVar44[iVar27].m_backend.data;
                          maxVal.m_backend.data._M_elems._8_8_ =
                               *(undefined8 *)(pnVar44[iVar27].m_backend.data._M_elems + 2);
                          puVar2 = pnVar44[iVar27].m_backend.data._M_elems + 4;
                          maxVal.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
                          uVar15 = *(undefined8 *)(puVar2 + 2);
                          maxVal.m_backend.data._M_elems._24_5_ = SUB85(uVar15,0);
                          maxVal.m_backend.data._M_elems[7]._1_3_ =
                               (undefined3)((ulong)uVar15 >> 0x28);
                          iVar8 = pnVar44[iVar27].m_backend.exp;
                          bVar3 = pnVar44[iVar27].m_backend.neg;
                          uVar15._0_4_ = pnVar44[iVar27].m_backend.fpclass;
                          uVar15._4_4_ = pnVar44[iVar27].m_backend.prec_elem;
                          pnVar44 = (lp->
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).left.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          uVar16 = *(undefined8 *)(pnVar44[iVar27].m_backend.data._M_elems + 8);
                          local_708.data._M_elems._32_5_ = SUB85(uVar16,0);
                          local_708.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar16 >> 0x28);
                          local_708.data._M_elems._0_8_ =
                               *(undefined8 *)&pnVar44[iVar27].m_backend.data;
                          local_708.data._M_elems._8_8_ =
                               *(undefined8 *)(pnVar44[iVar27].m_backend.data._M_elems + 2);
                          puVar2 = pnVar44[iVar27].m_backend.data._M_elems + 4;
                          local_708.data._M_elems._16_8_ = *(undefined8 *)puVar2;
                          uVar16 = *(undefined8 *)(puVar2 + 2);
                          local_708.data._M_elems._24_5_ = SUB85(uVar16,0);
                          local_708.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar16 >> 0x28);
                          iVar31 = pnVar44[iVar27].m_backend.exp;
                          bVar4 = pnVar44[iVar27].m_backend.neg;
                          pIVar34 = (lp->
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .set.theitem +
                                    (lp->
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).
                                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    .set.thekey[iVar27].idx;
                          uVar16._0_4_ = pnVar44[iVar27].m_backend.fpclass;
                          uVar16._4_4_ = pnVar44[iVar27].m_backend.prec_elem;
                          for (pnVar44 = updateRow.val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start;
                              pnVar44 !=
                              updateRow.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish; pnVar44 = pnVar44 + 1) {
                            (pnVar44->m_backend).fpclass = cpp_dec_float_finite;
                            (pnVar44->m_backend).prec_elem = 10;
                            (pnVar44->m_backend).data._M_elems[0] = 0;
                            (pnVar44->m_backend).data._M_elems[1] = 0;
                            (pnVar44->m_backend).data._M_elems[2] = 0;
                            (pnVar44->m_backend).data._M_elems[3] = 0;
                            (pnVar44->m_backend).data._M_elems[4] = 0;
                            (pnVar44->m_backend).data._M_elems[5] = 0;
                            (pnVar44->m_backend).data._M_elems[6] = 0;
                            (pnVar44->m_backend).data._M_elems[7] = 0;
                            *(undefined8 *)((long)(pnVar44->m_backend).data._M_elems + 0x1d) = 0;
                            *(undefined8 *)((long)(pnVar44->m_backend).data._M_elems + 0x25) = 0;
                          }
                          if (0 < (pIVar34->data).
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .memused) {
                            lVar38 = 0x38;
                            lVar45 = 0;
                            do {
                              pNVar46 = (pIVar34->data).
                                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .m_elem;
                              iVar27 = *(int *)((long)(pNVar46->val).m_backend.data._M_elems +
                                               lVar38);
                              *(undefined8 *)
                               (updateRow.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[iVar27].m_backend.data.
                                _M_elems + 8) =
                                   *(undefined8 *)
                                    ((long)(pNVar46->val).m_backend.data._M_elems + lVar38 + -0x18);
                              puVar2 = (uint *)((long)(&pNVar46->val + -1) + lVar38);
                              uVar13 = *puVar2;
                              uVar21 = puVar2[1];
                              uVar22 = puVar2[2];
                              uVar23 = puVar2[3];
                              puVar1 = (undefined8 *)
                                       ((long)(&(pNVar46->val).m_backend.data + -1) + lVar38);
                              uVar17 = puVar1[1];
                              puVar2 = updateRow.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[iVar27].m_backend.
                                       data._M_elems + 4;
                              *(undefined8 *)puVar2 = *puVar1;
                              *(undefined8 *)(puVar2 + 2) = uVar17;
                              pnVar44 = updateRow.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + iVar27;
                              (pnVar44->m_backend).data._M_elems[0] = uVar13;
                              (pnVar44->m_backend).data._M_elems[1] = uVar21;
                              (pnVar44->m_backend).data._M_elems[2] = uVar22;
                              (pnVar44->m_backend).data._M_elems[3] = uVar23;
                              updateRow.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar27].m_backend.exp =
                                   *(int *)((long)(pNVar46->val).m_backend.data._M_elems +
                                           lVar38 + -0x10);
                              updateRow.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar27].m_backend.neg =
                                   *(bool *)((long)(pNVar46->val).m_backend.data._M_elems +
                                            lVar38 + -0xc);
                              uVar17 = *(undefined8 *)
                                        ((long)(pNVar46->val).m_backend.data._M_elems + lVar38 + -8)
                              ;
                              updateRow.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar27].m_backend.fpclass =
                                   (int)uVar17;
                              updateRow.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar27].m_backend.prec_elem
                                   = (int)((ulong)uVar17 >> 0x20);
                              lVar45 = lVar45 + 1;
                              lVar38 = lVar38 + 0x3c;
                            } while (lVar45 < (pIVar34->data).
                                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              .memused);
                          }
                          if (0 < (this_01->data).
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .memused) {
                            lVar38 = 0;
                            do {
                              pnVar44 = updateRow.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start;
                              pNVar46 = (this_01->data).
                                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .m_elem;
                              uVar13 = pNVar46[lVar38].idx;
                              uVar42 = (ulong)uVar13;
                              if (local_918 != uVar42) {
                                pIVar34 = (lp->
                                          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).
                                          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          .set.theitem;
                                iVar27 = (lp->
                                         super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         ).
                                         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         .set.thekey[lVar53].idx;
                                pNVar47 = pIVar34[iVar27].data.
                                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          .m_elem;
                                if ((pNVar47 !=
                                     (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      *)0x0) &&
                                   (lVar45 = (long)pIVar34[iVar27].data.
                                                                                                      
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  .memused, 0 < lVar45)) {
                                  lVar39 = 0;
                                  do {
                                    if (*(uint *)((long)(&pNVar47->val + 1) + lVar39) == uVar13) {
                                      pNVar35 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                 *)(updateRow.val.
                                                                                                        
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                  local_918);
                                      pNVar46 = pNVar46 + lVar38;
                                      maxRes.m_backend.fpclass = cpp_dec_float_finite;
                                      maxRes.m_backend.prec_elem = 10;
                                      maxRes.m_backend.data._M_elems[0] = 0;
                                      maxRes.m_backend.data._M_elems[1] = 0;
                                      maxRes.m_backend.data._M_elems[2] = 0;
                                      maxRes.m_backend.data._M_elems[3] = 0;
                                      maxRes.m_backend.data._M_elems[4] = 0;
                                      maxRes.m_backend.data._M_elems[5] = 0;
                                      maxRes.m_backend.data._M_elems._24_5_ = 0;
                                      maxRes.m_backend.data._M_elems[7]._1_3_ = 0;
                                      maxRes.m_backend.data._M_elems._32_5_ = 0;
                                      maxRes.m_backend.data._M_elems[9]._1_3_ = 0;
                                      maxRes.m_backend.exp = 0;
                                      maxRes.m_backend.neg = false;
                                      pNVar47 = pNVar35;
                                      if (((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            *)&maxRes != pNVar46) &&
                                         (pNVar47 = pNVar46,
                                         (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          *)&maxRes != pNVar35)) {
                                        uVar17 = *(undefined8 *)
                                                  ((pNVar35->val).m_backend.data._M_elems + 8);
                                        maxRes.m_backend.data._M_elems._32_5_ = SUB85(uVar17,0);
                                        maxRes.m_backend.data._M_elems[9]._1_3_ =
                                             (undefined3)((ulong)uVar17 >> 0x28);
                                        maxRes.m_backend.data._M_elems._0_8_ =
                                             *(undefined8 *)(pNVar35->val).m_backend.data._M_elems;
                                        maxRes.m_backend.data._M_elems._8_8_ =
                                             *(undefined8 *)
                                              ((pNVar35->val).m_backend.data._M_elems + 2);
                                        maxRes.m_backend.data._M_elems._16_8_ =
                                             *(undefined8 *)
                                              ((pNVar35->val).m_backend.data._M_elems + 4);
                                        uVar17 = *(undefined8 *)
                                                  ((pNVar35->val).m_backend.data._M_elems + 6);
                                        maxRes.m_backend.data._M_elems._24_5_ = SUB85(uVar17,0);
                                        maxRes.m_backend.data._M_elems[7]._1_3_ =
                                             (undefined3)((ulong)uVar17 >> 0x28);
                                        maxRes.m_backend.exp =
                                             *(int *)(&(pNVar35->val).m_backend.data + 1);
                                        maxRes.m_backend.neg =
                                             *(bool *)((long)(&(pNVar35->val).m_backend.data + 1) +
                                                      4);
                                        maxRes.m_backend._48_8_ =
                                             *(undefined8 *)
                                              ((long)(&(pNVar35->val).m_backend.data + 1) + 8);
                                      }
                                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>
                                      ::operator*=(&maxRes.m_backend,
                                                   (cpp_dec_float<50U,_int,_void> *)pNVar47);
                                      minRes.m_backend.fpclass = cpp_dec_float_finite;
                                      minRes.m_backend.prec_elem = 10;
                                      minRes.m_backend.data._M_elems[0] = 0;
                                      minRes.m_backend.data._M_elems[1] = 0;
                                      minRes.m_backend.data._M_elems[2] = 0;
                                      minRes.m_backend.data._M_elems[3] = 0;
                                      minRes.m_backend.data._M_elems[4] = 0;
                                      minRes.m_backend.data._M_elems[5] = 0;
                                      minRes.m_backend.data._M_elems._24_5_ = 0;
                                      minRes.m_backend.data._M_elems[7]._1_3_ = 0;
                                      minRes.m_backend.data._M_elems._32_5_ = 0;
                                      minRes.m_backend.data._M_elems[9]._1_3_ = 0;
                                      minRes.m_backend.exp = 0;
                                      minRes.m_backend.neg = false;
                                      boost::multiprecision::default_ops::
                                      eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                                (&minRes.m_backend,&maxRes.m_backend,&rhs.m_backend)
                                      ;
                                      pcVar49 = &pnVar44[(int)uVar13].m_backend;
                                      t.m_backend.fpclass = cpp_dec_float_finite;
                                      t.m_backend.prec_elem = 10;
                                      t.m_backend.data._M_elems[0] = 0;
                                      t.m_backend.data._M_elems[1] = 0;
                                      t.m_backend.data._M_elems[2] = 0;
                                      t.m_backend.data._M_elems[3] = 0;
                                      t.m_backend.data._M_elems[4] = 0;
                                      t.m_backend.data._M_elems[5] = 0;
                                      t.m_backend.data._M_elems._24_5_ = 0;
                                      t.m_backend.data._M_elems[7]._1_3_ = 0;
                                      t.m_backend.data._M_elems._32_5_ = 0;
                                      t.m_backend.data._M_elems[9]._1_3_ = 0;
                                      t.m_backend.exp = 0;
                                      t.m_backend.neg = false;
                                      if (&t.m_backend != pcVar49) {
                                        uVar17 = *(undefined8 *)((pcVar49->data)._M_elems + 8);
                                        t.m_backend.data._M_elems._32_5_ = SUB85(uVar17,0);
                                        t.m_backend.data._M_elems[9]._1_3_ =
                                             (undefined3)((ulong)uVar17 >> 0x28);
                                        t.m_backend.data._M_elems._0_8_ =
                                             *(undefined8 *)(pcVar49->data)._M_elems;
                                        t.m_backend.data._M_elems._8_8_ =
                                             *(undefined8 *)((pcVar49->data)._M_elems + 2);
                                        t.m_backend.data._M_elems._16_8_ =
                                             *(undefined8 *)((pcVar49->data)._M_elems + 4);
                                        uVar17 = *(undefined8 *)((pcVar49->data)._M_elems + 6);
                                        t.m_backend.data._M_elems._24_5_ = SUB85(uVar17,0);
                                        t.m_backend.data._M_elems[7]._1_3_ =
                                             (undefined3)((ulong)uVar17 >> 0x28);
                                        t.m_backend.exp = pcVar49->exp;
                                        t.m_backend.neg = pcVar49->neg;
                                        t.m_backend.fpclass = pcVar49->fpclass;
                                        t.m_backend.prec_elem = pcVar49->prec_elem;
                                      }
                                      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>
                                      ::operator-=(&t.m_backend,&minRes.m_backend);
                                      (*(lp->
                                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        ).
                                        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                        .
                                        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._vptr_ClassArray[0x43])(lp,lVar53,uVar42,&t,0);
                                      goto LAB_002f123b;
                                    }
                                    lVar39 = lVar39 + 0x3c;
                                  } while (lVar45 * 0x3c - lVar39 != 0);
                                }
                                pnVar43 = updateRow.val.
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start + local_918;
                                minVal.m_backend.fpclass = cpp_dec_float_finite;
                                minVal.m_backend.prec_elem = 10;
                                minVal.m_backend.data._M_elems[0] = 0;
                                minVal.m_backend.data._M_elems[1] = 0;
                                minVal.m_backend.data._M_elems[2] = 0;
                                minVal.m_backend.data._M_elems[3] = 0;
                                minVal.m_backend.data._M_elems[4] = 0;
                                minVal.m_backend.data._M_elems[5] = 0;
                                minVal.m_backend.data._M_elems._24_5_ = 0;
                                minVal.m_backend.data._M_elems[7]._1_3_ = 0;
                                minVal.m_backend.data._M_elems._32_5_ = 0;
                                minVal.m_backend.data._M_elems[9]._1_3_ = 0;
                                minVal.m_backend.exp = 0;
                                minVal.m_backend.neg = false;
                                t.m_backend.fpclass = cpp_dec_float_finite;
                                t.m_backend.prec_elem = 10;
                                t.m_backend.data._M_elems[0] = 0;
                                t.m_backend.data._M_elems[1] = 0;
                                t.m_backend.data._M_elems[2] = 0;
                                t.m_backend.data._M_elems[3] = 0;
                                t.m_backend.data._M_elems[4] = 0;
                                t.m_backend.data._M_elems[5] = 0;
                                t.m_backend.data._M_elems._24_5_ = 0;
                                t.m_backend.data._M_elems[7]._1_3_ = 0;
                                t.m_backend.data._M_elems._32_5_ = 0;
                                t.m_backend.data._M_elems[9]._1_3_ = 0;
                                t.m_backend.exp = 0;
                                t.m_backend.neg = false;
                                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::
                                operator=((cpp_dec_float<50u,int,void> *)&t,-1.0);
                                if (&minVal != pnVar43) {
                                  uVar17 = *(undefined8 *)((pnVar43->m_backend).data._M_elems + 8);
                                  minVal.m_backend.data._M_elems._32_5_ = SUB85(uVar17,0);
                                  minVal.m_backend.data._M_elems[9]._1_3_ =
                                       (undefined3)((ulong)uVar17 >> 0x28);
                                  minVal.m_backend.data._M_elems._0_8_ =
                                       *(undefined8 *)(pnVar43->m_backend).data._M_elems;
                                  minVal.m_backend.data._M_elems._8_8_ =
                                       *(undefined8 *)((pnVar43->m_backend).data._M_elems + 2);
                                  minVal.m_backend.data._M_elems._16_8_ =
                                       *(undefined8 *)((pnVar43->m_backend).data._M_elems + 4);
                                  uVar17 = *(undefined8 *)((pnVar43->m_backend).data._M_elems + 6);
                                  minVal.m_backend.data._M_elems._24_5_ = SUB85(uVar17,0);
                                  minVal.m_backend.data._M_elems[7]._1_3_ =
                                       (undefined3)((ulong)uVar17 >> 0x28);
                                  minVal.m_backend.exp = (pnVar43->m_backend).exp;
                                  minVal.m_backend.neg = (pnVar43->m_backend).neg;
                                  minVal.m_backend.fpclass = (pnVar43->m_backend).fpclass;
                                  minVal.m_backend.prec_elem = (pnVar43->m_backend).prec_elem;
                                }
                                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                operator*=(&minVal.m_backend,&t.m_backend);
                                pNVar47 = (this_01->data).
                                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          .m_elem + lVar38;
                                maxRes.m_backend.fpclass = cpp_dec_float_finite;
                                maxRes.m_backend.prec_elem = 10;
                                maxRes.m_backend.data._M_elems[0] = 0;
                                maxRes.m_backend.data._M_elems[1] = 0;
                                maxRes.m_backend.data._M_elems[2] = 0;
                                maxRes.m_backend.data._M_elems[3] = 0;
                                maxRes.m_backend.data._M_elems[4] = 0;
                                maxRes.m_backend.data._M_elems[5] = 0;
                                maxRes.m_backend.data._M_elems._24_5_ = 0;
                                maxRes.m_backend.data._M_elems[7]._1_3_ = 0;
                                maxRes.m_backend.data._M_elems._32_5_ = 0;
                                maxRes.m_backend.data._M_elems[9]._1_3_ = 0;
                                maxRes.m_backend.exp = 0;
                                maxRes.m_backend.neg = false;
                                pNVar46 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           *)&minVal;
                                if ((Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     *)&maxRes != pNVar47) {
                                  maxRes.m_backend.data._M_elems._32_5_ =
                                       minVal.m_backend.data._M_elems._32_5_;
                                  maxRes.m_backend.data._M_elems[9]._1_3_ =
                                       minVal.m_backend.data._M_elems[9]._1_3_;
                                  maxRes.m_backend.data._M_elems[4] =
                                       minVal.m_backend.data._M_elems[4];
                                  maxRes.m_backend.data._M_elems[5] =
                                       minVal.m_backend.data._M_elems[5];
                                  maxRes.m_backend.data._M_elems._24_5_ =
                                       minVal.m_backend.data._M_elems._24_5_;
                                  maxRes.m_backend.data._M_elems[7]._1_3_ =
                                       minVal.m_backend.data._M_elems[7]._1_3_;
                                  maxRes.m_backend.data._M_elems[0] =
                                       minVal.m_backend.data._M_elems[0];
                                  maxRes.m_backend.data._M_elems[1] =
                                       minVal.m_backend.data._M_elems[1];
                                  maxRes.m_backend.data._M_elems[2] =
                                       minVal.m_backend.data._M_elems[2];
                                  maxRes.m_backend.data._M_elems[3] =
                                       minVal.m_backend.data._M_elems[3];
                                  maxRes.m_backend.exp = minVal.m_backend.exp;
                                  maxRes.m_backend.neg = minVal.m_backend.neg;
                                  maxRes.m_backend.fpclass = minVal.m_backend.fpclass;
                                  maxRes.m_backend.prec_elem = minVal.m_backend.prec_elem;
                                  pNVar46 = pNVar47;
                                }
                                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                operator*=(&maxRes.m_backend,
                                           (cpp_dec_float<50U,_int,_void> *)pNVar46);
                                minRes.m_backend.fpclass = cpp_dec_float_finite;
                                minRes.m_backend.prec_elem = 10;
                                minRes.m_backend.data._M_elems[0] = 0;
                                minRes.m_backend.data._M_elems[1] = 0;
                                minRes.m_backend.data._M_elems[2] = 0;
                                minRes.m_backend.data._M_elems[3] = 0;
                                minRes.m_backend.data._M_elems[4] = 0;
                                minRes.m_backend.data._M_elems[5] = 0;
                                minRes.m_backend.data._M_elems._24_5_ = 0;
                                minRes.m_backend.data._M_elems[7]._1_3_ = 0;
                                minRes.m_backend.data._M_elems._32_5_ = 0;
                                minRes.m_backend.data._M_elems[9]._1_3_ = 0;
                                minRes.m_backend.exp = 0;
                                minRes.m_backend.neg = false;
                                boost::multiprecision::default_ops::
                                eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                          (&minRes.m_backend,&maxRes.m_backend,&rhs.m_backend);
                                (*(lp->
                                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  ).
                                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .
                                  super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._vptr_ClassArray[0x43])(lp,lVar53,uVar42,&minRes);
                              }
LAB_002f123b:
                              lVar38 = lVar38 + 1;
                            } while (lVar38 < (this_01->data).
                                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              .memused);
                          }
                          pcVar49 = &(lp->
                                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).right.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar53].m_backend;
                          ::soplex::infinity::__tls_init();
                          t.m_backend.fpclass = cpp_dec_float_finite;
                          t.m_backend.prec_elem = 10;
                          t.m_backend.data._M_elems[0] = 0;
                          t.m_backend.data._M_elems[1] = 0;
                          t.m_backend.data._M_elems[2] = 0;
                          t.m_backend.data._M_elems[3] = 0;
                          t.m_backend.data._M_elems[4] = 0;
                          t.m_backend.data._M_elems[5] = 0;
                          t.m_backend.data._M_elems._24_5_ = 0;
                          t.m_backend.data._M_elems[7]._1_3_ = 0;
                          t.m_backend.data._M_elems._32_5_ = 0;
                          t.m_backend.data._M_elems[9]._1_3_ = 0;
                          t.m_backend.exp = 0;
                          t.m_backend.neg = false;
                          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                    ((cpp_dec_float<50u,int,void> *)&t,a);
                          if (((pcVar49->fpclass != cpp_dec_float_NaN) &&
                              (t.m_backend.fpclass != cpp_dec_float_NaN)) &&
                             (iVar27 = boost::multiprecision::backends::
                                       cpp_dec_float<50U,_int,_void>::compare(pcVar49,&t.m_backend),
                             iVar27 < 0)) {
                            pnVar43 = updateRow.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + local_918;
                            maxRes.m_backend.fpclass = cpp_dec_float_finite;
                            maxRes.m_backend.prec_elem = 10;
                            maxRes.m_backend.data._M_elems[0] = 0;
                            maxRes.m_backend.data._M_elems[1] = 0;
                            maxRes.m_backend.data._M_elems[2] = 0;
                            maxRes.m_backend.data._M_elems[3] = 0;
                            maxRes.m_backend.data._M_elems[4] = 0;
                            maxRes.m_backend.data._M_elems[5] = 0;
                            maxRes.m_backend.data._M_elems._24_5_ = 0;
                            maxRes.m_backend.data._M_elems[7]._1_3_ = 0;
                            maxRes.m_backend.data._M_elems._32_5_ = 0;
                            maxRes.m_backend.data._M_elems[9]._1_3_ = 0;
                            maxRes.m_backend.exp = 0;
                            maxRes.m_backend.neg = false;
                            if (&maxRes != pnVar43) {
                              uVar17 = *(undefined8 *)((pnVar43->m_backend).data._M_elems + 8);
                              maxRes.m_backend.data._M_elems._32_5_ = SUB85(uVar17,0);
                              maxRes.m_backend.data._M_elems[9]._1_3_ =
                                   (undefined3)((ulong)uVar17 >> 0x28);
                              maxRes.m_backend.data._M_elems._0_8_ =
                                   *(undefined8 *)(pnVar43->m_backend).data._M_elems;
                              maxRes.m_backend.data._M_elems._8_8_ =
                                   *(undefined8 *)((pnVar43->m_backend).data._M_elems + 2);
                              maxRes.m_backend.data._M_elems._16_8_ =
                                   *(undefined8 *)((pnVar43->m_backend).data._M_elems + 4);
                              uVar17 = *(undefined8 *)((pnVar43->m_backend).data._M_elems + 6);
                              maxRes.m_backend.data._M_elems._24_5_ = SUB85(uVar17,0);
                              maxRes.m_backend.data._M_elems[7]._1_3_ =
                                   (undefined3)((ulong)uVar17 >> 0x28);
                              maxRes.m_backend.exp = (pnVar43->m_backend).exp;
                              maxRes.m_backend.neg = (pnVar43->m_backend).neg;
                              maxRes.m_backend.fpclass = (pnVar43->m_backend).fpclass;
                              maxRes.m_backend.prec_elem = (pnVar43->m_backend).prec_elem;
                            }
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            operator*=(&maxRes.m_backend,&lhs.m_backend);
                            minRes.m_backend.fpclass = cpp_dec_float_finite;
                            minRes.m_backend.prec_elem = 10;
                            minRes.m_backend.data._M_elems[0] = 0;
                            minRes.m_backend.data._M_elems[1] = 0;
                            minRes.m_backend.data._M_elems[2] = 0;
                            minRes.m_backend.data._M_elems[3] = 0;
                            minRes.m_backend.data._M_elems[4] = 0;
                            minRes.m_backend.data._M_elems[5] = 0;
                            minRes.m_backend.data._M_elems._24_5_ = 0;
                            minRes.m_backend.data._M_elems[7]._1_3_ = 0;
                            minRes.m_backend.data._M_elems._32_5_ = 0;
                            minRes.m_backend.data._M_elems[9]._1_3_ = 0;
                            minRes.m_backend.exp = 0;
                            minRes.m_backend.neg = false;
                            boost::multiprecision::default_ops::
                            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                      (&minRes.m_backend,&maxRes.m_backend,&rhs.m_backend);
                            t.m_backend.data._M_elems._32_5_ = maxVal.m_backend.data._M_elems._32_5_
                            ;
                            t.m_backend.data._M_elems[9]._1_3_ =
                                 maxVal.m_backend.data._M_elems[9]._1_3_;
                            t.m_backend.data._M_elems[4] = maxVal.m_backend.data._M_elems[4];
                            t.m_backend.data._M_elems[5] = maxVal.m_backend.data._M_elems[5];
                            t.m_backend.data._M_elems._24_5_ = maxVal.m_backend.data._M_elems._24_5_
                            ;
                            t.m_backend.data._M_elems[7]._1_3_ =
                                 maxVal.m_backend.data._M_elems[7]._1_3_;
                            t.m_backend.data._M_elems[0] = maxVal.m_backend.data._M_elems[0];
                            t.m_backend.data._M_elems[1] = maxVal.m_backend.data._M_elems[1];
                            t.m_backend.data._M_elems[2] = maxVal.m_backend.data._M_elems[2];
                            t.m_backend.data._M_elems[3] = maxVal.m_backend.data._M_elems[3];
                            t.m_backend.exp = iVar8;
                            t.m_backend.neg = bVar3;
                            t.m_backend._48_8_ = uVar15;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            operator-=(&t.m_backend,&minRes.m_backend);
                            (*(lp->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._vptr_ClassArray[0x36])(lp,lVar53,&t,0);
                          }
                          pcVar49 = &(lp->
                                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).left.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar53].m_backend;
                          ::soplex::infinity::__tls_init();
                          t.m_backend.fpclass = cpp_dec_float_finite;
                          t.m_backend.prec_elem = 10;
                          t.m_backend.data._M_elems[0] = 0;
                          t.m_backend.data._M_elems[1] = 0;
                          t.m_backend.data._M_elems[2] = 0;
                          t.m_backend.data._M_elems[3] = 0;
                          t.m_backend.data._M_elems[4] = 0;
                          t.m_backend.data._M_elems[5] = 0;
                          t.m_backend.data._M_elems._24_5_ = 0;
                          t.m_backend.data._M_elems[7]._1_3_ = 0;
                          t.m_backend.data._M_elems._32_5_ = 0;
                          t.m_backend.data._M_elems[9]._1_3_ = 0;
                          t.m_backend.exp = 0;
                          t.m_backend.neg = false;
                          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                    ((cpp_dec_float<50u,int,void> *)&t,-a);
                          if (((pcVar49->fpclass != cpp_dec_float_NaN) &&
                              (t.m_backend.fpclass != cpp_dec_float_NaN)) &&
                             (iVar27 = boost::multiprecision::backends::
                                       cpp_dec_float<50U,_int,_void>::compare(pcVar49,&t.m_backend),
                             0 < iVar27)) {
                            pnVar43 = updateRow.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + local_918;
                            maxRes.m_backend.fpclass = cpp_dec_float_finite;
                            maxRes.m_backend.prec_elem = 10;
                            maxRes.m_backend.data._M_elems[0] = 0;
                            maxRes.m_backend.data._M_elems[1] = 0;
                            maxRes.m_backend.data._M_elems[2] = 0;
                            maxRes.m_backend.data._M_elems[3] = 0;
                            maxRes.m_backend.data._M_elems[4] = 0;
                            maxRes.m_backend.data._M_elems[5] = 0;
                            maxRes.m_backend.data._M_elems._24_5_ = 0;
                            maxRes.m_backend.data._M_elems[7]._1_3_ = 0;
                            maxRes.m_backend.data._M_elems._32_5_ = 0;
                            maxRes.m_backend.data._M_elems[9]._1_3_ = 0;
                            maxRes.m_backend.exp = 0;
                            maxRes.m_backend.neg = false;
                            if (&maxRes != pnVar43) {
                              uVar15 = *(undefined8 *)((pnVar43->m_backend).data._M_elems + 8);
                              maxRes.m_backend.data._M_elems._32_5_ = SUB85(uVar15,0);
                              maxRes.m_backend.data._M_elems[9]._1_3_ =
                                   (undefined3)((ulong)uVar15 >> 0x28);
                              maxRes.m_backend.data._M_elems._0_8_ =
                                   *(undefined8 *)(pnVar43->m_backend).data._M_elems;
                              maxRes.m_backend.data._M_elems._8_8_ =
                                   *(undefined8 *)((pnVar43->m_backend).data._M_elems + 2);
                              maxRes.m_backend.data._M_elems._16_8_ =
                                   *(undefined8 *)((pnVar43->m_backend).data._M_elems + 4);
                              uVar15 = *(undefined8 *)((pnVar43->m_backend).data._M_elems + 6);
                              maxRes.m_backend.data._M_elems._24_5_ = SUB85(uVar15,0);
                              maxRes.m_backend.data._M_elems[7]._1_3_ =
                                   (undefined3)((ulong)uVar15 >> 0x28);
                              maxRes.m_backend.exp = (pnVar43->m_backend).exp;
                              maxRes.m_backend.neg = (pnVar43->m_backend).neg;
                              maxRes.m_backend.fpclass = (pnVar43->m_backend).fpclass;
                              maxRes.m_backend.prec_elem = (pnVar43->m_backend).prec_elem;
                            }
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            operator*=(&maxRes.m_backend,&lhs.m_backend);
                            minRes.m_backend.fpclass = cpp_dec_float_finite;
                            minRes.m_backend.prec_elem = 10;
                            minRes.m_backend.data._M_elems[0] = 0;
                            minRes.m_backend.data._M_elems[1] = 0;
                            minRes.m_backend.data._M_elems[2] = 0;
                            minRes.m_backend.data._M_elems[3] = 0;
                            minRes.m_backend.data._M_elems[4] = 0;
                            minRes.m_backend.data._M_elems[5] = 0;
                            minRes.m_backend.data._M_elems._24_5_ = 0;
                            minRes.m_backend.data._M_elems[7]._1_3_ = 0;
                            minRes.m_backend.data._M_elems._32_5_ = 0;
                            minRes.m_backend.data._M_elems[9]._1_3_ = 0;
                            minRes.m_backend.exp = 0;
                            minRes.m_backend.neg = false;
                            boost::multiprecision::default_ops::
                            eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                      (&minRes.m_backend,&maxRes.m_backend,&rhs.m_backend);
                            t.m_backend.data._M_elems._32_5_ = local_708.data._M_elems._32_5_;
                            t.m_backend.data._M_elems[9]._1_3_ = local_708.data._M_elems[9]._1_3_;
                            t.m_backend.data._M_elems[4] = local_708.data._M_elems[4];
                            t.m_backend.data._M_elems[5] = local_708.data._M_elems[5];
                            t.m_backend.data._M_elems._24_5_ = local_708.data._M_elems._24_5_;
                            t.m_backend.data._M_elems[7]._1_3_ = local_708.data._M_elems[7]._1_3_;
                            t.m_backend.data._M_elems[0] = local_708.data._M_elems[0];
                            t.m_backend.data._M_elems[1] = local_708.data._M_elems[1];
                            t.m_backend.data._M_elems[2] = local_708.data._M_elems[2];
                            t.m_backend.data._M_elems[3] = local_708.data._M_elems[3];
                            t.m_backend.exp = iVar31;
                            t.m_backend.neg = bVar4;
                            t.m_backend._48_8_ = uVar16;
                            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                            operator-=(&t.m_backend,&minRes.m_backend);
                            (*(lp->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._vptr_ClassArray[0x33])(lp,lVar53,&t,0);
                          }
                          if (updateRow.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(updateRow.val.
                                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)updateRow.val.
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)updateRow.val.
                                                                                                        
                                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                          iVar27 = (pIVar14->data).
                                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .memused;
                        }
                        lVar51 = lVar51 + 1;
                      } while (lVar51 < iVar27);
                    }
                    iVar27 = (this_01->data).
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .memused;
                    if (0 < iVar27) {
                      lVar51 = 0;
                      lVar53 = 0;
                      do {
                        pNVar46 = (this_01->data).
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .m_elem;
                        uVar13 = *(uint *)((long)(&pNVar46->val + 1) + lVar51);
                        if (local_918 != uVar13) {
                          pnVar44 = (lp->
                                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).object.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                          pcVar36 = &pnVar44[local_918].m_backend;
                          pcVar48 = (cpp_dec_float<50U,_int,_void> *)
                                    ((long)(pNVar46->val).m_backend.data._M_elems + lVar51);
                          maxRes.m_backend.fpclass = cpp_dec_float_finite;
                          maxRes.m_backend.prec_elem = 10;
                          maxRes.m_backend.data._M_elems[0] = 0;
                          maxRes.m_backend.data._M_elems[1] = 0;
                          maxRes.m_backend.data._M_elems[2] = 0;
                          maxRes.m_backend.data._M_elems[3] = 0;
                          maxRes.m_backend.data._M_elems[4] = 0;
                          maxRes.m_backend.data._M_elems[5] = 0;
                          maxRes.m_backend.data._M_elems._24_5_ = 0;
                          maxRes.m_backend.data._M_elems[7]._1_3_ = 0;
                          maxRes.m_backend.data._M_elems._32_5_ = 0;
                          maxRes.m_backend.data._M_elems[9]._1_3_ = 0;
                          maxRes.m_backend.exp = 0;
                          maxRes.m_backend.neg = false;
                          pcVar49 = pcVar36;
                          if ((pcVar48 != &maxRes.m_backend) &&
                             (pcVar49 = pcVar48, &maxRes.m_backend != pcVar36)) {
                            uVar15 = *(undefined8 *)
                                      ((((cpp_dec_float<50U,_int,_void> *)&pcVar36->data)->data).
                                       _M_elems + 8);
                            maxRes.m_backend.data._M_elems._32_5_ = SUB85(uVar15,0);
                            maxRes.m_backend.data._M_elems[9]._1_3_ =
                                 (undefined3)((ulong)uVar15 >> 0x28);
                            maxRes.m_backend.data._M_elems._0_8_ =
                                 *(undefined8 *)
                                  (((cpp_dec_float<50U,_int,_void> *)&pcVar36->data)->data)._M_elems
                            ;
                            maxRes.m_backend.data._M_elems._8_8_ =
                                 *(undefined8 *)
                                  ((((cpp_dec_float<50U,_int,_void> *)&pcVar36->data)->data).
                                   _M_elems + 2);
                            maxRes.m_backend.data._M_elems._16_8_ =
                                 *(undefined8 *)
                                  ((((cpp_dec_float<50U,_int,_void> *)&pcVar36->data)->data).
                                   _M_elems + 4);
                            uVar15 = *(undefined8 *)
                                      ((((cpp_dec_float<50U,_int,_void> *)&pcVar36->data)->data).
                                       _M_elems + 6);
                            maxRes.m_backend.data._M_elems._24_5_ = SUB85(uVar15,0);
                            maxRes.m_backend.data._M_elems[7]._1_3_ =
                                 (undefined3)((ulong)uVar15 >> 0x28);
                            maxRes.m_backend.exp = pcVar36->exp;
                            maxRes.m_backend.neg = pcVar36->neg;
                            maxRes.m_backend.fpclass = pcVar36->fpclass;
                            maxRes.m_backend.prec_elem = pcVar36->prec_elem;
                          }
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                                    (&maxRes.m_backend,pcVar49);
                          minRes.m_backend.fpclass = cpp_dec_float_finite;
                          minRes.m_backend.prec_elem = 10;
                          minRes.m_backend.data._M_elems[0] = 0;
                          minRes.m_backend.data._M_elems[1] = 0;
                          minRes.m_backend.data._M_elems[2] = 0;
                          minRes.m_backend.data._M_elems[3] = 0;
                          minRes.m_backend.data._M_elems[4] = 0;
                          minRes.m_backend.data._M_elems[5] = 0;
                          minRes.m_backend.data._M_elems._24_5_ = 0;
                          minRes.m_backend.data._M_elems[7]._1_3_ = 0;
                          minRes.m_backend.data._M_elems._32_5_ = 0;
                          minRes.m_backend.data._M_elems[9]._1_3_ = 0;
                          minRes.m_backend.exp = 0;
                          minRes.m_backend.neg = false;
                          boost::multiprecision::default_ops::
                          eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                                    (&minRes.m_backend,&maxRes.m_backend,&rhs.m_backend);
                          ptVar50 = (type *)(pnVar44 + (int)uVar13);
                          t.m_backend.fpclass = cpp_dec_float_finite;
                          t.m_backend.prec_elem = 10;
                          t.m_backend.data._M_elems[0] = 0;
                          t.m_backend.data._M_elems[1] = 0;
                          t.m_backend.data._M_elems[2] = 0;
                          t.m_backend.data._M_elems[3] = 0;
                          t.m_backend.data._M_elems[4] = 0;
                          t.m_backend.data._M_elems[5] = 0;
                          t.m_backend.data._M_elems._24_5_ = 0;
                          t.m_backend.data._M_elems[7]._1_3_ = 0;
                          t.m_backend.data._M_elems._32_5_ = 0;
                          t.m_backend.data._M_elems[9]._1_3_ = 0;
                          t.m_backend.exp = 0;
                          t.m_backend.neg = false;
                          if (&t != ptVar50) {
                            uVar15 = *(undefined8 *)((ptVar50->m_backend).data._M_elems + 8);
                            t.m_backend.data._M_elems._32_5_ = SUB85(uVar15,0);
                            t.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28)
                            ;
                            t.m_backend.data._M_elems._0_8_ =
                                 *(undefined8 *)(ptVar50->m_backend).data._M_elems;
                            t.m_backend.data._M_elems._8_8_ =
                                 *(undefined8 *)((ptVar50->m_backend).data._M_elems + 2);
                            t.m_backend.data._M_elems._16_8_ =
                                 *(undefined8 *)((ptVar50->m_backend).data._M_elems + 4);
                            uVar15 = *(undefined8 *)((ptVar50->m_backend).data._M_elems + 6);
                            t.m_backend.data._M_elems._24_5_ = SUB85(uVar15,0);
                            t.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28)
                            ;
                            t.m_backend.exp = (ptVar50->m_backend).exp;
                            t.m_backend.neg = (ptVar50->m_backend).neg;
                            t.m_backend.fpclass = (ptVar50->m_backend).fpclass;
                            t.m_backend.prec_elem = (ptVar50->m_backend).prec_elem;
                          }
                          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                                    (&t.m_backend,&minRes.m_backend);
                          (*(lp->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .
                            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._vptr_ClassArray[0x27])(lp,(ulong)uVar13,&t,0);
                          iVar27 = (this_01->data).
                                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .memused;
                        }
                        lVar53 = lVar53 + 1;
                        lVar51 = lVar51 + 0x3c;
                      } while (lVar53 < iVar27);
                    }
                    iVar27 = (lp->
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .set.theitem
                             [(lp->
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thekey[local_918].idx].data.
                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .memused;
                    piVar18 = (this->m_cIdx).data;
                    piVar18[local_918] =
                         piVar18[(long)(lp->
                                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).
                                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       .set.thenum + -1];
                    (*(lp->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._vptr_ClassArray[0x15])();
                    iVar8 = (lp->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.theitem
                            [(lp->
                             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .set.thekey[uVar41].idx].data.
                            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .memused;
                    piVar18 = (this->m_rIdx).data;
                    piVar18[uVar41] =
                         piVar18[(long)(lp->
                                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       ).
                                       super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       .set.thenum + -1];
                    (*(lp->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).
                      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .
                      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._vptr_ClassArray[0xf])();
                    piVar18 = (this->m_stat).data + 0x10;
                    *piVar18 = *piVar18 + 1;
                    if (ptr.
                        super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                (ptr.
                                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi);
                    }
                    local_8bc = local_8bc + 1;
                    iVar32 = iVar32 + 1;
                    local_95c = local_95c + iVar27 + iVar8;
                  }
                  break;
                }
LAB_002f063e:
                if (bVar40) {
                  minVal.m_backend.fpclass = cpp_dec_float_finite;
                  minVal.m_backend.prec_elem = 10;
                  minVal.m_backend.data._M_elems[0] = 0;
                  minVal.m_backend.data._M_elems[1] = 0;
                  minVal.m_backend.data._M_elems[2] = 0;
                  minVal.m_backend.data._M_elems[3] = 0;
                  minVal.m_backend.data._M_elems[4] = 0;
                  minVal.m_backend.data._M_elems[5] = 0;
                  minVal.m_backend.data._M_elems._24_5_ = 0;
                  minVal.m_backend.data._M_elems[7]._1_3_ = 0;
                  minVal.m_backend.data._M_elems._32_5_ = 0;
                  minVal.m_backend.data._M_elems[9]._1_3_ = 0;
                  minVal.m_backend.exp = 0;
                  minVal.m_backend.neg = false;
                  maxVal.m_backend.fpclass = cpp_dec_float_finite;
                  maxVal.m_backend.prec_elem = 10;
                  maxVal.m_backend.data._M_elems[0] = 0;
                  maxVal.m_backend.data._M_elems[1] = 0;
                  maxVal.m_backend.data._M_elems[2] = 0;
                  maxVal.m_backend.data._M_elems[3] = 0;
                  maxVal.m_backend.data._M_elems[4] = 0;
                  maxVal.m_backend.data._M_elems[5] = 0;
                  maxVal.m_backend.data._M_elems._24_5_ = 0;
                  maxVal.m_backend.data._M_elems[7]._1_3_ = 0;
                  maxVal.m_backend.data._M_elems._32_5_ = 0;
                  maxVal.m_backend.data._M_elems[9]._1_3_ = 0;
                  maxVal.m_backend.exp = 0;
                  maxVal.m_backend.neg = false;
                  local_288.m_backend.data._M_elems[7]._1_3_ = rhs.m_backend.data._M_elems[7]._1_3_;
                  local_288.m_backend.data._M_elems._24_5_ = rhs.m_backend.data._M_elems._24_5_;
                  local_288.m_backend.data._M_elems[0] = rhs.m_backend.data._M_elems[0];
                  local_288.m_backend.data._M_elems[1] = rhs.m_backend.data._M_elems[1];
                  local_288.m_backend.data._M_elems[2] = rhs.m_backend.data._M_elems[2];
                  local_288.m_backend.data._M_elems[3] = rhs.m_backend.data._M_elems[3];
                  local_288.m_backend.data._M_elems[4] = rhs.m_backend.data._M_elems[4];
                  local_288.m_backend.data._M_elems[5] = rhs.m_backend.data._M_elems[5];
                  local_288.m_backend.data._M_elems[9]._1_3_ = rhs.m_backend.data._M_elems[9]._1_3_;
                  local_288.m_backend.data._M_elems._32_5_ = rhs.m_backend.data._M_elems._32_5_;
                  local_288.m_backend.exp = rhs.m_backend.exp;
                  local_288.m_backend.neg = rhs.m_backend.neg;
                  local_288.m_backend.fpclass = rhs.m_backend.fpclass;
                  local_288.m_backend.prec_elem = rhs.m_backend.prec_elem;
                  local_508 = ptr.
                              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr;
                  p_Stack_500 = ptr.
                                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi;
                  local_2c8.m_backend.data._M_elems[9]._1_3_ =
                       minRes.m_backend.data._M_elems[9]._1_3_;
                  local_2c8.m_backend.data._M_elems._32_5_ = minRes.m_backend.data._M_elems._32_5_;
                  local_2c8.m_backend.data._M_elems[7]._1_3_ =
                       minRes.m_backend.data._M_elems[7]._1_3_;
                  local_2c8.m_backend.data._M_elems._24_5_ = minRes.m_backend.data._M_elems._24_5_;
                  local_2c8.m_backend.data._M_elems[4] = minRes.m_backend.data._M_elems[4];
                  local_2c8.m_backend.data._M_elems[5] = minRes.m_backend.data._M_elems[5];
                  local_2c8.m_backend.data._M_elems[0] = minRes.m_backend.data._M_elems[0];
                  local_2c8.m_backend.data._M_elems[1] = minRes.m_backend.data._M_elems[1];
                  local_2c8.m_backend.data._M_elems[2] = minRes.m_backend.data._M_elems[2];
                  local_2c8.m_backend.data._M_elems[3] = minRes.m_backend.data._M_elems[3];
                  local_2c8.m_backend.exp = minRes.m_backend.exp;
                  local_2c8.m_backend.neg = minRes.m_backend.neg;
                  local_2c8.m_backend.fpclass = minRes.m_backend.fpclass;
                  local_2c8.m_backend.prec_elem = minRes.m_backend.prec_elem;
                  local_308.m_backend.data._M_elems[9]._1_3_ =
                       maxRes.m_backend.data._M_elems[9]._1_3_;
                  local_308.m_backend.data._M_elems._32_5_ = maxRes.m_backend.data._M_elems._32_5_;
                  local_308.m_backend.data._M_elems[7]._1_3_ =
                       maxRes.m_backend.data._M_elems[7]._1_3_;
                  local_308.m_backend.data._M_elems._24_5_ = maxRes.m_backend.data._M_elems._24_5_;
                  local_308.m_backend.data._M_elems[4] = maxRes.m_backend.data._M_elems[4];
                  local_308.m_backend.data._M_elems[5] = maxRes.m_backend.data._M_elems[5];
                  local_308.m_backend.data._M_elems[0] = maxRes.m_backend.data._M_elems[0];
                  local_308.m_backend.data._M_elems[1] = maxRes.m_backend.data._M_elems[1];
                  local_308.m_backend.data._M_elems[2] = maxRes.m_backend.data._M_elems[2];
                  local_308.m_backend.data._M_elems[3] = maxRes.m_backend.data._M_elems[3];
                  local_308.m_backend.exp = maxRes.m_backend.exp;
                  local_308.m_backend.neg = maxRes.m_backend.neg;
                  local_308.m_backend.fpclass = maxRes.m_backend.fpclass;
                  local_308.m_backend.prec_elem = maxRes.m_backend.prec_elem;
                  local_4f8 = (uint  [2])uVar16;
                  auStack_4f0 = (uint  [2])uVar17;
                  local_4e8 = (uint  [2])uVar15;
                  local_4e0 = iVar31;
                  local_4dc = (bool)uVar5;
                  local_4d8 = fVar11;
                  local_4d4 = iVar12;
                  computeMinMaxValues(this,lp,&local_288,
                                      (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                       *)&local_508,&local_2c8,&local_308,&minVal,&maxVal);
                  ::soplex::infinity::__tls_init();
                  local_708.fpclass = cpp_dec_float_finite;
                  local_708.prec_elem = 10;
                  local_708.data._M_elems[0] = 0;
                  local_708.data._M_elems[1] = 0;
                  local_708.data._M_elems[2] = 0;
                  local_708.data._M_elems[3] = 0;
                  local_708.data._M_elems[4] = 0;
                  local_708.data._M_elems[5] = 0;
                  local_708.data._M_elems._24_5_ = 0;
                  local_708.data._M_elems[7]._1_3_ = 0;
                  local_708.data._M_elems._32_5_ = 0;
                  local_708.data._M_elems[9]._1_3_ = 0;
                  local_708.exp = 0;
                  local_708.neg = false;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)&local_708,-a);
                  if (((minVal.m_backend.fpclass != cpp_dec_float_NaN) &&
                      (local_708.fpclass != cpp_dec_float_NaN)) &&
                     (iVar30 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(&minVal.m_backend,&local_708),
                     uVar15 = minVal.m_backend._48_8_, bVar26 = minVal.m_backend.neg,
                     iVar31 = minVal.m_backend.exp, 0 < iVar30)) {
                    local_5c8 = CONCAT35(minVal.m_backend.data._M_elems[9]._1_3_,
                                         minVal.m_backend.data._M_elems._32_5_);
                    uStack_5d0 = CONCAT35(minVal.m_backend.data._M_elems[7]._1_3_,
                                          minVal.m_backend.data._M_elems._24_5_);
                    local_5d8[0] = minVal.m_backend.data._M_elems[4];
                    local_5d8[1] = minVal.m_backend.data._M_elems[5];
                    local_5e8[0] = minVal.m_backend.data._M_elems[0];
                    local_5e8[1] = minVal.m_backend.data._M_elems[1];
                    auStack_5e0[0] = minVal.m_backend.data._M_elems[2];
                    auStack_5e0[1] = minVal.m_backend.data._M_elems[3];
                    local_548.data._M_elems[0] = local_618[0];
                    local_548.data._M_elems[1] = local_618[1];
                    local_548.data._M_elems[2] = auStack_610[0];
                    local_548.data._M_elems[3] = auStack_610[1];
                    local_548.data._M_elems[4] = local_608[0];
                    local_548.data._M_elems[5] = local_608[1];
                    local_548.data._M_elems[6] = auStack_600[0];
                    local_548.data._M_elems[7] = auStack_600[1];
                    local_548.data._M_elems[8] = local_5f8[0];
                    local_548.data._M_elems[9] = local_5f8[1];
                    local_548.exp = iVar27;
                    local_548.neg = bVar3;
                    local_548.fpclass = fVar6;
                    local_548.prec_elem = iVar7;
                    feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_148,this);
                    uVar16 = minVal.m_backend._48_8_;
                    t.m_backend.data._M_elems._32_5_ = SUB85(local_5c8,0);
                    t.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_5c8 >> 0x28);
                    t.m_backend.data._M_elems[4] = local_5d8[0];
                    t.m_backend.data._M_elems[5] = local_5d8[1];
                    t.m_backend.data._M_elems._24_5_ = SUB85(uStack_5d0,0);
                    t.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_5d0 >> 0x28);
                    t.m_backend.data._M_elems[0] = local_5e8[0];
                    t.m_backend.data._M_elems[1] = local_5e8[1];
                    t.m_backend.data._M_elems[2] = auStack_5e0[0];
                    t.m_backend.data._M_elems[3] = auStack_5e0[1];
                    t.m_backend.exp = iVar31;
                    t.m_backend.neg = bVar26;
                    minVal.m_backend.fpclass = (fpclass_type)uVar15;
                    minVal.m_backend.prec_elem = SUB84(uVar15,4);
                    t.m_backend.fpclass = minVal.m_backend.fpclass;
                    t.m_backend.prec_elem = minVal.m_backend.prec_elem;
                    minVal.m_backend._48_8_ = uVar16;
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                              (&t.m_backend,&local_548);
                    if (((t.m_backend.fpclass != cpp_dec_float_NaN) &&
                        (local_148.fpclass != cpp_dec_float_NaN)) &&
                       (iVar31 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                 compare(&t.m_backend,&local_148), 0 < iVar31)) {
                      ::soplex::infinity::__tls_init();
                      updateRow.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                      updateRow.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                      updateRow.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                                ((cpp_dec_float<50u,int,void> *)&updateRow,a);
                      if ((maxVal.m_backend.fpclass != cpp_dec_float_NaN) &&
                         (iVar31 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                                   compare(&maxVal.m_backend,
                                           (cpp_dec_float<50U,_int,_void> *)&updateRow), iVar31 < 0)
                         ) {
                        local_348.m_backend.data._M_elems[9]._1_3_ =
                             maxVal.m_backend.data._M_elems[9]._1_3_;
                        local_348.m_backend.data._M_elems._32_5_ =
                             maxVal.m_backend.data._M_elems._32_5_;
                        local_348.m_backend.data._M_elems[7]._1_3_ =
                             maxVal.m_backend.data._M_elems[7]._1_3_;
                        local_348.m_backend.data._M_elems._24_5_ =
                             maxVal.m_backend.data._M_elems._24_5_;
                        local_348.m_backend.data._M_elems[4] = maxVal.m_backend.data._M_elems[4];
                        local_348.m_backend.data._M_elems[5] = maxVal.m_backend.data._M_elems[5];
                        local_348.m_backend.data._M_elems[0] = maxVal.m_backend.data._M_elems[0];
                        local_348.m_backend.data._M_elems[1] = maxVal.m_backend.data._M_elems[1];
                        local_348.m_backend.data._M_elems[2] = maxVal.m_backend.data._M_elems[2];
                        local_348.m_backend.data._M_elems[3] = maxVal.m_backend.data._M_elems[3];
                        local_348.m_backend.exp = maxVal.m_backend.exp;
                        local_348.m_backend.neg = maxVal.m_backend.neg;
                        local_348.m_backend.fpclass = maxVal.m_backend.fpclass;
                        local_348.m_backend.prec_elem = maxVal.m_backend.prec_elem;
                        local_588.m_backend.data._M_elems[0] = local_648[0];
                        local_588.m_backend.data._M_elems[1] = local_648[1];
                        local_588.m_backend.data._M_elems[2] = auStack_640[0];
                        local_588.m_backend.data._M_elems[3] = auStack_640[1];
                        local_588.m_backend.data._M_elems[4] = local_638[0];
                        local_588.m_backend.data._M_elems[5] = local_638[1];
                        local_588.m_backend.data._M_elems[6] = auStack_630[0];
                        local_588.m_backend.data._M_elems[7] = auStack_630[1];
                        local_588.m_backend.data._M_elems[8] = local_628[0];
                        local_588.m_backend.data._M_elems[9] = local_628[1];
                        local_588.m_backend.exp = iVar8;
                        local_588.m_backend.neg = bVar4;
                        local_588.m_backend.fpclass = fVar9;
                        local_588.m_backend.prec_elem = iVar10;
                        feastol(&local_d8,this);
                        bVar26 = LT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                           (&local_348,&local_588,&local_d8);
                        if (bVar26) {
                          uVar41 = *(uint *)((long)(&((pIVar14->data).
                                                                                                            
                                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                                  .m_elem)->val + 1) + lVar53);
                          bVar3 = false;
                          goto LAB_002f0c5a;
                        }
                      }
                    }
                  }
                }
              }
LAB_002f0ba3:
              lVar51 = lVar51 + 1;
              lVar53 = lVar53 + 0x3c;
            } while (lVar51 < (pIVar14->data).
                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .memused);
          }
        }
      }
    } while (1 < (long)local_650);
  }
  uVar41 = iVar32 + local_8bc;
  if (uVar41 != 0 && SCARRY4(iVar32,local_8bc) == (int)uVar41 < 0) {
    piVar18 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_remRows;
    *piVar18 = *piVar18 + iVar32;
    piVar18 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_remCols;
    *piVar18 = *piVar18 + local_8bc;
    piVar18 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_remNzos;
    *piVar18 = *piVar18 + local_95c;
    pSVar19 = (this->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    if ((pSVar19 != (SPxOut *)0x0) && (3 < (int)pSVar19->m_verbosity)) {
      t.m_backend.data._M_elems[0] = pSVar19->m_verbosity;
      lhs.m_backend.data._M_elems[0] = 4;
      (*pSVar19->_vptr_SPxOut[2])();
      pSVar19 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar19->m_streams[pSVar19->m_verbosity],"Simplifier (multi-aggregation) removed ",
                 0x27);
      std::ostream::operator<<((ostream *)pSVar19->m_streams[pSVar19->m_verbosity],iVar32);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar19->m_streams[pSVar19->m_verbosity]," rows, ",7);
      std::ostream::operator<<((ostream *)pSVar19->m_streams[pSVar19->m_verbosity],local_8bc);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar19->m_streams[pSVar19->m_verbosity]," cols, ",7);
      std::ostream::operator<<((ostream *)pSVar19->m_streams[pSVar19->m_verbosity],local_95c);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar19->m_streams[pSVar19->m_verbosity]," non-zeros",10);
      cVar20 = (char)pSVar19->m_streams[pSVar19->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar19->m_streams[pSVar19->m_verbosity] + -0x18) + cVar20);
      std::ostream::put(cVar20);
      std::ostream::flush();
      pSVar19 = (this->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar19->_vptr_SPxOut[2])(pSVar19,&t);
    }
    lhs.m_backend.fpclass = cpp_dec_float_finite;
    lhs.m_backend.prec_elem = 10;
    lhs.m_backend.data._M_elems[0] = 0;
    lhs.m_backend.data._M_elems[1] = 0;
    lhs.m_backend.data._M_elems[2] = 0;
    lhs.m_backend.data._M_elems[3] = 0;
    lhs.m_backend.data._M_elems[4] = 0;
    lhs.m_backend.data._M_elems[5] = 0;
    lhs.m_backend.data._M_elems._24_5_ = 0;
    lhs.m_backend.data._M_elems[7]._1_3_ = 0;
    lhs.m_backend.data._M_elems._32_5_ = 0;
    lhs.m_backend.data._M_elems[9]._1_3_ = 0;
    lhs.m_backend.exp = 0;
    lhs.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&t.m_backend,iVar33 + local_658,(type *)0x0);
    pnVar43 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_minReduction;
    if (&lhs != pnVar43) {
      uVar15 = *(undefined8 *)
                ((this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.data._M_elems + 8);
      lhs.m_backend.data._M_elems._32_5_ = SUB85(uVar15,0);
      lhs.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28);
      lhs.m_backend.data._M_elems._0_8_ = *(undefined8 *)(pnVar43->m_backend).data._M_elems;
      lhs.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)
            ((this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_minReduction.m_backend.data._M_elems + 2);
      lhs.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)
            ((this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_minReduction.m_backend.data._M_elems + 4);
      uVar15 = *(undefined8 *)
                ((this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).m_minReduction.m_backend.data._M_elems + 6);
      lhs.m_backend.data._M_elems._24_5_ = SUB85(uVar15,0);
      lhs.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar15 >> 0x28);
      lhs.m_backend.exp =
           (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).m_minReduction.m_backend.exp;
      lhs.m_backend.neg =
           (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).m_minReduction.m_backend.neg;
      lhs.m_backend.fpclass =
           (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).m_minReduction.m_backend.fpclass;
      lhs.m_backend.prec_elem =
           (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).m_minReduction.m_backend.prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&lhs.m_backend,&t.m_backend);
    if (lhs.m_backend.fpclass != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (&t.m_backend,(ulong)uVar41,(type *)0x0);
      iVar33 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&lhs.m_backend,&t.m_backend);
      if (iVar33 < 0) {
        *local_660 = true;
      }
    }
  }
  if (downLocks.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(downLocks.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)downLocks.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)downLocks.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (upLocks.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(upLocks.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)upLocks.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)upLocks.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return OKAY;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::multiaggregation(SPxLPBase<R>& lp, bool& again)
{
   // this simplifier eliminates rows and columns by performing multi aggregations as identified by the constraint
   // activities.
   int remRows = 0;
   int remCols = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();
   int oldCols = lp.nCols();

   VectorBase<R> upLocks(lp.nCols());
   VectorBase<R> downLocks(lp.nCols());

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      // setting the locks on the variables
      upLocks[j] = 0;
      downLocks[j] = 0;

      if(lp.colVector(j).size() <= 1)
         continue;

      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(lp.lhs(col.index(k)) > R(-infinity) && lp.rhs(col.index(k)) < R(infinity))
         {
            upLocks[j]++;
            downLocks[j]++;
         }
         else if(lp.lhs(col.index(k)) > R(-infinity))
         {
            if(aij > 0)
               downLocks[j]++;
            else if(aij < 0)
               upLocks[j]++;
         }
         else if(lp.rhs(col.index(k)) < R(infinity))
         {
            if(aij > 0)
               upLocks[j]++;
            else if(aij < 0)
               downLocks[j]++;
         }
      }

      // multi-aggregate column
      if(upLocks[j] == 1 || downLocks[j] == 1)
      {
         R lower = lp.lower(j);
         R upper = lp.upper(j);
         int maxOtherLocks;
         int bestpos = -1;
         bool bestislhs = true;

         for(int k = 0; k < col.size(); ++k)
         {
            int rowNumber;
            R lhs;
            R rhs;
            bool lhsExists;
            bool rhsExists;
            bool aggLhs;
            bool aggRhs;

            R val = col.value(k);

            rowNumber = col.index(k);
            lhs = lp.lhs(rowNumber);
            rhs = lp.rhs(rowNumber);

            if(EQ(lhs, rhs, feastol()))
               continue;

            lhsExists = lhs > R(-infinity);
            rhsExists = rhs < R(infinity);

            if(lp.rowVector(rowNumber).size() <= 2)
               maxOtherLocks = INT_MAX;
            else if(lp.rowVector(rowNumber).size() == 3)
               maxOtherLocks = 3;
            else if(lp.rowVector(rowNumber).size() == 4)
               maxOtherLocks = 2;
            else
               maxOtherLocks = 1;

            aggLhs = lhsExists
                     && ((col.value(k) > 0.0 && lp.maxObj(j) <= 0.0 && downLocks[j] == 1 && upLocks[j] <= maxOtherLocks)
                         || (col.value(k) < 0.0 && lp.maxObj(j) >= 0.0 && upLocks[j] == 1 && downLocks[j] <= maxOtherLocks));
            aggRhs = rhsExists
                     && ((col.value(k) > 0.0 && lp.maxObj(j) >= 0.0 && upLocks[j] == 1 && downLocks[j] <= maxOtherLocks)
                         || (col.value(k) < 0.0 && lp.maxObj(j) <= 0.0 && downLocks[j] == 1 && upLocks[j] <= maxOtherLocks));

            if(aggLhs || aggRhs)
            {
               R minRes = 0;   // this is the minimum value that the aggregation can attain
               R maxRes = 0;   // this is the maximum value that the aggregation can attain

               // computing the minimum and maximum residuals if variable j is set to zero.
               computeMinMaxResidualActivity(lp, rowNumber, j, minRes, maxRes);

               // we will try to aggregate to the lhs
               if(aggLhs)
               {
                  R minVal;
                  R maxVal;

                  // computing the values of the upper and lower bounds for the aggregated variables
                  computeMinMaxValues(lp, lhs, val, minRes, maxRes, minVal, maxVal);

                  assert(LE(minVal, maxVal, this->tolerances()->epsilon()));

                  // if the bounds of the aggregation and the original variable are equivalent, then we can reduce
                  if((minVal > R(-infinity) && GT(minVal, lower, feastol()))
                        && (maxVal < R(infinity) && LT(maxVal, upper, feastol())))
                  {
                     bestpos = col.index(k);
                     bestislhs = true;
                     break;
                  }
               }

               // we will try to aggregate to the rhs
               if(aggRhs)
               {
                  R minVal;
                  R maxVal;

                  // computing the values of the upper and lower bounds for the aggregated variables
                  computeMinMaxValues(lp, rhs, val, minRes, maxRes, minVal, maxVal);

                  assert(LE(minVal, maxVal, this->tolerances()->epsilon()));

                  if((minVal > R(-infinity) && GT(minVal, lower, feastol()))
                        && (maxVal < R(infinity) && LT(maxVal, upper, feastol())))
                  {
                     bestpos = col.index(k);
                     bestislhs = false;
                     break;
                  }
               }
            }
         }

         // it is only possible to aggregate if a best position has been found
         if(bestpos >= 0)
         {
            const SVectorBase<R>& bestRow = lp.rowVector(bestpos);
            // aggregating the variable and applying the fixings to the all other constraints
            R aggConstant = (bestislhs ? lp.lhs(bestpos) : lp.rhs(
                                bestpos));   // this is the lhs or rhs of the aggregated row
            R aggAij =
               bestRow[j];                                   // this is the coefficient of the deleted col

            SPxOut::debug(this,
                          "IMAISM51 col {}: Aggregating row: {} Aggregation Constant={} Coefficient of aggregated col={}\n",
                          j, bestpos, aggConstant, aggAij);

            std::shared_ptr<PostStep> ptr(new MultiAggregationPS(lp, *this, bestpos, j,
                                          aggConstant, this->_tolerances));
            m_hist.append(ptr);

            for(int k = 0; k < col.size(); ++k)
            {
               if(col.index(k) != bestpos)
               {
                  int rowNumber = col.index(k);
                  VectorBase<R> updateRow(lp.nCols());
                  R updateRhs = lp.rhs(col.index(k));
                  R updateLhs = lp.lhs(col.index(k));

                  updateRow = lp.rowVector(col.index(k));

                  // updating the row with the best row
                  for(int l = 0; l < bestRow.size(); l++)
                  {
                     if(bestRow.index(l) != j)
                     {
                        if(lp.rowVector(rowNumber).pos(bestRow.index(l)) >= 0)
                           lp.changeElement(rowNumber, bestRow.index(l), updateRow[bestRow.index(l)]
                                            - updateRow[j]*bestRow.value(l) / aggAij);
                        else
                           lp.changeElement(rowNumber, bestRow.index(l), -1.0 * updateRow[j]*bestRow.value(l) / aggAij);
                     }
                  }

                  // NOTE: I don't know whether we should change the LHS and RHS if they are currently at R(infinity)
                  if(lp.rhs(rowNumber) < R(infinity))
                     lp.changeRhs(rowNumber, updateRhs - updateRow[j]*aggConstant / aggAij);

                  if(lp.lhs(rowNumber) > R(-infinity))
                     lp.changeLhs(rowNumber, updateLhs - updateRow[j]*aggConstant / aggAij);

                  assert(LE(lp.lhs(rowNumber), lp.rhs(rowNumber), this->tolerances()->epsilon()));
               }
            }

            for(int l = 0; l < bestRow.size(); l++)
            {
               if(bestRow.index(l) != j)
                  lp.changeMaxObj(bestRow.index(l),
                                  lp.maxObj(bestRow.index(l)) - lp.maxObj(j)*bestRow.value(l) / aggAij);
            }

            ++remCols;
            remNzos += lp.colVector(j).size();
            removeCol(lp, j);
            ++remRows;
            remNzos += lp.rowVector(bestpos).size();
            removeRow(lp, bestpos);

            ++m_stat[MULTI_AGG];
         }
      }
   }


   assert(remRows > 0 || remCols > 0 || remNzos == 0);

   if(remCols + remRows > 0)
   {
      this->m_remRows += remRows;
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (multi-aggregation) removed "
                    << remRows << " rows, "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols + remRows > this->m_minReduction * (oldCols + oldRows))
         again = true;
   }

   return this->OKAY;
}